

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::RibbonCurve1Intersector1<embree::BSplineCurveT,4>,embree::sse2::Intersect1EpilogMU<4,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  int iVar18;
  __int_type_conflict _Var19;
  long lVar20;
  undefined8 uVar21;
  undefined6 uVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  int iVar48;
  ulong uVar49;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar50;
  int iVar51;
  undefined4 uVar52;
  RTCIntersectArguments *pRVar53;
  ulong uVar54;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong uVar55;
  Geometry *pGVar56;
  ulong uVar57;
  long lVar58;
  long lVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  short sVar66;
  float fVar67;
  float fVar68;
  float fVar101;
  float fVar103;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar102;
  float fVar104;
  float fVar105;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar136;
  float fVar139;
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar137;
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar144;
  float fVar154;
  float fVar155;
  vfloat4 v;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar156;
  float fVar172;
  float fVar173;
  vfloat4 v_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar174;
  float fVar183;
  float fVar185;
  undefined1 auVar175 [16];
  float fVar184;
  float fVar186;
  float fVar187;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar188;
  float fVar211;
  float fVar212;
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar213;
  float fVar217;
  float fVar218;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar219;
  float fVar226;
  float fVar227;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar228;
  float fVar230;
  float fVar231;
  undefined1 auVar229 [16];
  float fVar232;
  float fVar238;
  float fVar239;
  undefined1 auVar233 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar240;
  float fVar241;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined4 uVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined4 uVar253;
  undefined1 auVar242 [16];
  undefined1 auVar245 [16];
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar266;
  float fVar276;
  float fVar277;
  float fVar279;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  float fVar280;
  undefined1 auVar275 [16];
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar289;
  float fVar291;
  float fVar293;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar290;
  float fVar292;
  float fVar294;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined4 uVar295;
  float fVar296;
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_4> bhit;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_44c;
  float fStack_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [8];
  undefined8 uStack_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined8 local_408;
  undefined8 uStack_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  RTCIntersectArguments *local_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  ulong local_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  Precalculations *local_320;
  RTCFilterFunctionNArguments local_318;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined8 local_278;
  float local_270;
  float local_26c;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 local_260;
  uint local_25c;
  uint local_258;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  Primitive *local_160;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  uint local_128;
  int local_124;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  float local_c8 [4];
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8 [4];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 uVar99;
  undefined2 uVar100;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  
  PVar17 = prim[1];
  uVar49 = (ulong)(byte)PVar17;
  lVar20 = uVar49 * 0x25;
  pPVar7 = prim + lVar20 + 6;
  fVar155 = *(float *)(pPVar7 + 0xc);
  fVar156 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar7) * fVar155;
  fVar172 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar7 + 4)) * fVar155;
  fVar173 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar7 + 8)) * fVar155;
  fVar144 = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar154 = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar155 = fVar155 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar295 = *(undefined4 *)(prim + uVar49 * 4 + 6);
  uVar99 = (undefined1)((uint)uVar295 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar295 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar295));
  uVar99 = (undefined1)((uint)uVar295 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar99),uVar99);
  sVar66 = CONCAT11((char)uVar295,(char)uVar295);
  uVar55 = CONCAT62(uVar22,sVar66);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar55;
  auVar69._12_2_ = uVar100;
  auVar69._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar146._12_4_ = auVar69._12_4_;
  auVar146._8_2_ = 0;
  auVar146._0_8_ = uVar55;
  auVar146._10_2_ = uVar100;
  auVar70._10_6_ = auVar146._10_6_;
  auVar70._8_2_ = uVar100;
  auVar70._0_8_ = uVar55;
  uVar100 = (undefined2)uVar22;
  auVar23._4_8_ = auVar70._8_8_;
  auVar23._2_2_ = uVar100;
  auVar23._0_2_ = uVar100;
  fVar281 = (float)((int)sVar66 >> 8);
  fVar289 = (float)(auVar23._0_4_ >> 0x18);
  fVar291 = (float)(auVar70._8_4_ >> 0x18);
  uVar295 = *(undefined4 *)(prim + uVar49 * 5 + 6);
  uVar99 = (undefined1)((uint)uVar295 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar295 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar295));
  uVar99 = (undefined1)((uint)uVar295 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar99),uVar99);
  sVar66 = CONCAT11((char)uVar295,(char)uVar295);
  uVar55 = CONCAT62(uVar22,sVar66);
  auVar111._8_4_ = 0;
  auVar111._0_8_ = uVar55;
  auVar111._12_2_ = uVar100;
  auVar111._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._8_2_ = 0;
  auVar110._0_8_ = uVar55;
  auVar110._10_2_ = uVar100;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._8_2_ = uVar100;
  auVar109._0_8_ = uVar55;
  uVar100 = (undefined2)uVar22;
  auVar24._4_8_ = auVar109._8_8_;
  auVar24._2_2_ = uVar100;
  auVar24._0_2_ = uVar100;
  fVar174 = (float)((int)sVar66 >> 8);
  fVar183 = (float)(auVar24._0_4_ >> 0x18);
  fVar185 = (float)(auVar109._8_4_ >> 0x18);
  uVar295 = *(undefined4 *)(prim + uVar49 * 6 + 6);
  uVar99 = (undefined1)((uint)uVar295 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar295 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar295));
  uVar99 = (undefined1)((uint)uVar295 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar99),uVar99);
  sVar66 = CONCAT11((char)uVar295,(char)uVar295);
  uVar55 = CONCAT62(uVar22,sVar66);
  auVar114._8_4_ = 0;
  auVar114._0_8_ = uVar55;
  auVar114._12_2_ = uVar100;
  auVar114._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._8_2_ = 0;
  auVar113._0_8_ = uVar55;
  auVar113._10_2_ = uVar100;
  auVar112._10_6_ = auVar113._10_6_;
  auVar112._8_2_ = uVar100;
  auVar112._0_8_ = uVar55;
  uVar100 = (undefined2)uVar22;
  auVar25._4_8_ = auVar112._8_8_;
  auVar25._2_2_ = uVar100;
  auVar25._0_2_ = uVar100;
  fVar213 = (float)((int)sVar66 >> 8);
  fVar217 = (float)(auVar25._0_4_ >> 0x18);
  fVar218 = (float)(auVar112._8_4_ >> 0x18);
  uVar295 = *(undefined4 *)(prim + uVar49 * 0xf + 6);
  uVar99 = (undefined1)((uint)uVar295 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar295 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar295));
  uVar99 = (undefined1)((uint)uVar295 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar99),uVar99);
  sVar66 = CONCAT11((char)uVar295,(char)uVar295);
  uVar55 = CONCAT62(uVar22,sVar66);
  auVar117._8_4_ = 0;
  auVar117._0_8_ = uVar55;
  auVar117._12_2_ = uVar100;
  auVar117._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._8_2_ = 0;
  auVar116._0_8_ = uVar55;
  auVar116._10_2_ = uVar100;
  auVar115._10_6_ = auVar116._10_6_;
  auVar115._8_2_ = uVar100;
  auVar115._0_8_ = uVar55;
  uVar100 = (undefined2)uVar22;
  auVar26._4_8_ = auVar115._8_8_;
  auVar26._2_2_ = uVar100;
  auVar26._0_2_ = uVar100;
  fVar67 = (float)((int)sVar66 >> 8);
  fVar101 = (float)(auVar26._0_4_ >> 0x18);
  fVar103 = (float)(auVar115._8_4_ >> 0x18);
  uVar295 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar99 = (undefined1)((uint)uVar295 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar295 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar295));
  uVar99 = (undefined1)((uint)uVar295 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar99),uVar99);
  sVar66 = CONCAT11((char)uVar295,(char)uVar295);
  uVar55 = CONCAT62(uVar22,sVar66);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar55;
  auVar191._12_2_ = uVar100;
  auVar191._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar55;
  auVar190._10_2_ = uVar100;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar100;
  auVar189._0_8_ = uVar55;
  uVar100 = (undefined2)uVar22;
  auVar27._4_8_ = auVar189._8_8_;
  auVar27._2_2_ = uVar100;
  auVar27._0_2_ = uVar100;
  fVar219 = (float)((int)sVar66 >> 8);
  fVar226 = (float)(auVar27._0_4_ >> 0x18);
  fVar227 = (float)(auVar189._8_4_ >> 0x18);
  uVar295 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar49 + 6);
  uVar99 = (undefined1)((uint)uVar295 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar295 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar295));
  uVar99 = (undefined1)((uint)uVar295 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar99),uVar99);
  sVar66 = CONCAT11((char)uVar295,(char)uVar295);
  uVar55 = CONCAT62(uVar22,sVar66);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar55;
  auVar194._12_2_ = uVar100;
  auVar194._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar55;
  auVar193._10_2_ = uVar100;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar100;
  auVar192._0_8_ = uVar55;
  uVar100 = (undefined2)uVar22;
  auVar28._4_8_ = auVar192._8_8_;
  auVar28._2_2_ = uVar100;
  auVar28._0_2_ = uVar100;
  fVar232 = (float)((int)sVar66 >> 8);
  fVar238 = (float)(auVar28._0_4_ >> 0x18);
  fVar239 = (float)(auVar192._8_4_ >> 0x18);
  uVar295 = *(undefined4 *)(prim + uVar49 * 0x1a + 6);
  uVar99 = (undefined1)((uint)uVar295 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar295 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar295));
  uVar99 = (undefined1)((uint)uVar295 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar99),uVar99);
  sVar66 = CONCAT11((char)uVar295,(char)uVar295);
  uVar55 = CONCAT62(uVar22,sVar66);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar55;
  auVar197._12_2_ = uVar100;
  auVar197._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar55;
  auVar196._10_2_ = uVar100;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar100;
  auVar195._0_8_ = uVar55;
  uVar100 = (undefined2)uVar22;
  auVar29._4_8_ = auVar195._8_8_;
  auVar29._2_2_ = uVar100;
  auVar29._0_2_ = uVar100;
  fVar228 = (float)((int)sVar66 >> 8);
  fVar230 = (float)(auVar29._0_4_ >> 0x18);
  fVar231 = (float)(auVar195._8_4_ >> 0x18);
  uVar295 = *(undefined4 *)(prim + uVar49 * 0x1b + 6);
  uVar99 = (undefined1)((uint)uVar295 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar295 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar295));
  uVar99 = (undefined1)((uint)uVar295 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar99),uVar99);
  sVar66 = CONCAT11((char)uVar295,(char)uVar295);
  uVar55 = CONCAT62(uVar22,sVar66);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar55;
  auVar200._12_2_ = uVar100;
  auVar200._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar55;
  auVar199._10_2_ = uVar100;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar100;
  auVar198._0_8_ = uVar55;
  uVar100 = (undefined2)uVar22;
  auVar30._4_8_ = auVar198._8_8_;
  auVar30._2_2_ = uVar100;
  auVar30._0_2_ = uVar100;
  fVar240 = (float)((int)sVar66 >> 8);
  fVar246 = (float)(auVar30._0_4_ >> 0x18);
  fVar250 = (float)(auVar198._8_4_ >> 0x18);
  uVar295 = *(undefined4 *)(prim + uVar49 * 0x1c + 6);
  uVar99 = (undefined1)((uint)uVar295 >> 0x18);
  uVar100 = CONCAT11(uVar99,uVar99);
  uVar99 = (undefined1)((uint)uVar295 >> 0x10);
  uVar21 = CONCAT35(CONCAT21(uVar100,uVar99),CONCAT14(uVar99,uVar295));
  uVar99 = (undefined1)((uint)uVar295 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar21 >> 0x20),uVar99),uVar99);
  sVar66 = CONCAT11((char)uVar295,(char)uVar295);
  uVar55 = CONCAT62(uVar22,sVar66);
  auVar203._8_4_ = 0;
  auVar203._0_8_ = uVar55;
  auVar203._12_2_ = uVar100;
  auVar203._14_2_ = uVar100;
  uVar100 = (undefined2)((ulong)uVar21 >> 0x20);
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._8_2_ = 0;
  auVar202._0_8_ = uVar55;
  auVar202._10_2_ = uVar100;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._8_2_ = uVar100;
  auVar201._0_8_ = uVar55;
  uVar100 = (undefined2)uVar22;
  auVar31._4_8_ = auVar201._8_8_;
  auVar31._2_2_ = uVar100;
  auVar31._0_2_ = uVar100;
  fVar106 = (float)((int)sVar66 >> 8);
  fVar136 = (float)(auVar31._0_4_ >> 0x18);
  fVar139 = (float)(auVar201._8_4_ >> 0x18);
  fVar266 = fVar144 * fVar281 + fVar154 * fVar174 + fVar155 * fVar213;
  fVar276 = fVar144 * fVar289 + fVar154 * fVar183 + fVar155 * fVar217;
  fVar277 = fVar144 * fVar291 + fVar154 * fVar185 + fVar155 * fVar218;
  fVar279 = fVar144 * (float)(auVar146._12_4_ >> 0x18) +
            fVar154 * (float)(auVar110._12_4_ >> 0x18) + fVar155 * (float)(auVar113._12_4_ >> 0x18);
  fVar256 = fVar144 * fVar67 + fVar154 * fVar219 + fVar155 * fVar232;
  fVar263 = fVar144 * fVar101 + fVar154 * fVar226 + fVar155 * fVar238;
  fVar264 = fVar144 * fVar103 + fVar154 * fVar227 + fVar155 * fVar239;
  fVar265 = fVar144 * (float)(auVar116._12_4_ >> 0x18) +
            fVar154 * (float)(auVar190._12_4_ >> 0x18) + fVar155 * (float)(auVar193._12_4_ >> 0x18);
  fVar188 = fVar144 * fVar228 + fVar154 * fVar240 + fVar155 * fVar106;
  fVar211 = fVar144 * fVar230 + fVar154 * fVar246 + fVar155 * fVar136;
  fVar212 = fVar144 * fVar231 + fVar154 * fVar250 + fVar155 * fVar139;
  fVar144 = fVar144 * (float)(auVar196._12_4_ >> 0x18) +
            fVar154 * (float)(auVar199._12_4_ >> 0x18) + fVar155 * (float)(auVar202._12_4_ >> 0x18);
  fVar282 = fVar281 * fVar156 + fVar174 * fVar172 + fVar213 * fVar173;
  fVar289 = fVar289 * fVar156 + fVar183 * fVar172 + fVar217 * fVar173;
  fVar291 = fVar291 * fVar156 + fVar185 * fVar172 + fVar218 * fVar173;
  fVar293 = (float)(auVar146._12_4_ >> 0x18) * fVar156 +
            (float)(auVar110._12_4_ >> 0x18) * fVar172 + (float)(auVar113._12_4_ >> 0x18) * fVar173;
  fVar232 = fVar67 * fVar156 + fVar219 * fVar172 + fVar232 * fVar173;
  fVar238 = fVar101 * fVar156 + fVar226 * fVar172 + fVar238 * fVar173;
  fVar239 = fVar103 * fVar156 + fVar227 * fVar172 + fVar239 * fVar173;
  fVar281 = (float)(auVar116._12_4_ >> 0x18) * fVar156 +
            (float)(auVar190._12_4_ >> 0x18) * fVar172 + (float)(auVar193._12_4_ >> 0x18) * fVar173;
  fVar228 = fVar156 * fVar228 + fVar172 * fVar240 + fVar173 * fVar106;
  fVar230 = fVar156 * fVar230 + fVar172 * fVar246 + fVar173 * fVar136;
  fVar231 = fVar156 * fVar231 + fVar172 * fVar250 + fVar173 * fVar139;
  fVar240 = fVar156 * (float)(auVar196._12_4_ >> 0x18) +
            fVar172 * (float)(auVar199._12_4_ >> 0x18) + fVar173 * (float)(auVar202._12_4_ >> 0x18);
  fVar155 = (float)DAT_01ff1d40;
  fVar67 = DAT_01ff1d40._4_4_;
  fVar101 = DAT_01ff1d40._8_4_;
  fVar103 = DAT_01ff1d40._12_4_;
  uVar60 = -(uint)(fVar155 <= ABS(fVar266));
  uVar61 = -(uint)(fVar67 <= ABS(fVar276));
  uVar62 = -(uint)(fVar101 <= ABS(fVar277));
  uVar63 = -(uint)(fVar103 <= ABS(fVar279));
  auVar267._0_4_ = (uint)fVar266 & uVar60;
  auVar267._4_4_ = (uint)fVar276 & uVar61;
  auVar267._8_4_ = (uint)fVar277 & uVar62;
  auVar267._12_4_ = (uint)fVar279 & uVar63;
  auVar157._0_4_ = ~uVar60 & (uint)fVar155;
  auVar157._4_4_ = ~uVar61 & (uint)fVar67;
  auVar157._8_4_ = ~uVar62 & (uint)fVar101;
  auVar157._12_4_ = ~uVar63 & (uint)fVar103;
  auVar157 = auVar157 | auVar267;
  uVar60 = -(uint)(fVar155 <= ABS(fVar256));
  uVar61 = -(uint)(fVar67 <= ABS(fVar263));
  uVar62 = -(uint)(fVar101 <= ABS(fVar264));
  uVar63 = -(uint)(fVar103 <= ABS(fVar265));
  auVar257._0_4_ = (uint)fVar256 & uVar60;
  auVar257._4_4_ = (uint)fVar263 & uVar61;
  auVar257._8_4_ = (uint)fVar264 & uVar62;
  auVar257._12_4_ = (uint)fVar265 & uVar63;
  auVar214._0_4_ = ~uVar60 & (uint)fVar155;
  auVar214._4_4_ = ~uVar61 & (uint)fVar67;
  auVar214._8_4_ = ~uVar62 & (uint)fVar101;
  auVar214._12_4_ = ~uVar63 & (uint)fVar103;
  auVar214 = auVar214 | auVar257;
  uVar60 = -(uint)(fVar155 <= ABS(fVar188));
  uVar61 = -(uint)(fVar67 <= ABS(fVar211));
  uVar62 = -(uint)(fVar101 <= ABS(fVar212));
  uVar63 = -(uint)(fVar103 <= ABS(fVar144));
  auVar204._0_4_ = (uint)fVar188 & uVar60;
  auVar204._4_4_ = (uint)fVar211 & uVar61;
  auVar204._8_4_ = (uint)fVar212 & uVar62;
  auVar204._12_4_ = (uint)fVar144 & uVar63;
  auVar220._0_4_ = ~uVar60 & (uint)fVar155;
  auVar220._4_4_ = ~uVar61 & (uint)fVar67;
  auVar220._8_4_ = ~uVar62 & (uint)fVar101;
  auVar220._12_4_ = ~uVar63 & (uint)fVar103;
  auVar220 = auVar220 | auVar204;
  auVar70 = rcpps(_DAT_01ff1d40,auVar157);
  fVar155 = auVar70._0_4_;
  fVar103 = auVar70._4_4_;
  fVar174 = auVar70._8_4_;
  fVar219 = auVar70._12_4_;
  fVar155 = (1.0 - auVar157._0_4_ * fVar155) * fVar155 + fVar155;
  fVar103 = (1.0 - auVar157._4_4_ * fVar103) * fVar103 + fVar103;
  fVar174 = (1.0 - auVar157._8_4_ * fVar174) * fVar174 + fVar174;
  fVar219 = (1.0 - auVar157._12_4_ * fVar219) * fVar219 + fVar219;
  auVar70 = rcpps(auVar70,auVar214);
  fVar67 = auVar70._0_4_;
  fVar106 = auVar70._4_4_;
  fVar183 = auVar70._8_4_;
  fVar226 = auVar70._12_4_;
  fVar67 = (1.0 - auVar214._0_4_ * fVar67) * fVar67 + fVar67;
  fVar106 = (1.0 - auVar214._4_4_ * fVar106) * fVar106 + fVar106;
  fVar183 = (1.0 - auVar214._8_4_ * fVar183) * fVar183 + fVar183;
  fVar226 = (1.0 - auVar214._12_4_ * fVar226) * fVar226 + fVar226;
  auVar70 = rcpps(auVar70,auVar220);
  fVar101 = auVar70._0_4_;
  fVar136 = auVar70._4_4_;
  fVar185 = auVar70._8_4_;
  fVar227 = auVar70._12_4_;
  fVar101 = (1.0 - auVar220._0_4_ * fVar101) * fVar101 + fVar101;
  fVar136 = (1.0 - auVar220._4_4_ * fVar136) * fVar136 + fVar136;
  fVar185 = (1.0 - auVar220._8_4_ * fVar185) * fVar185 + fVar185;
  fVar227 = (1.0 - auVar220._12_4_ * fVar227) * fVar227 + fVar227;
  fVar246 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar20 + 0x16)) *
            *(float *)(prim + lVar20 + 0x1a);
  uVar55 = *(ulong *)(prim + uVar49 * 7 + 6);
  uVar100 = (undefined2)(uVar55 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar55;
  auVar73._12_2_ = uVar100;
  auVar73._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar55 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar55;
  auVar72._10_2_ = uVar100;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar100;
  auVar71._0_8_ = uVar55;
  uVar100 = (undefined2)(uVar55 >> 0x10);
  auVar32._4_8_ = auVar71._8_8_;
  auVar32._2_2_ = uVar100;
  auVar32._0_2_ = uVar100;
  fVar139 = (float)(auVar32._0_4_ >> 0x10);
  fVar188 = (float)(auVar71._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar49 * 0xb + 6);
  uVar100 = (undefined2)(uVar54 >> 0x30);
  auVar160._8_4_ = 0;
  auVar160._0_8_ = uVar54;
  auVar160._12_2_ = uVar100;
  auVar160._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar54 >> 0x20);
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._8_2_ = 0;
  auVar159._0_8_ = uVar54;
  auVar159._10_2_ = uVar100;
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._8_2_ = uVar100;
  auVar158._0_8_ = uVar54;
  uVar100 = (undefined2)(uVar54 >> 0x10);
  auVar33._4_8_ = auVar158._8_8_;
  auVar33._2_2_ = uVar100;
  auVar33._0_2_ = uVar100;
  uVar9 = *(ulong *)(prim + uVar49 * 9 + 6);
  uVar100 = (undefined2)(uVar9 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar9;
  auVar76._12_2_ = uVar100;
  auVar76._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar9 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar9;
  auVar75._10_2_ = uVar100;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar100;
  auVar74._0_8_ = uVar9;
  uVar100 = (undefined2)(uVar9 >> 0x10);
  auVar34._4_8_ = auVar74._8_8_;
  auVar34._2_2_ = uVar100;
  auVar34._0_2_ = uVar100;
  fVar144 = (float)(auVar34._0_4_ >> 0x10);
  fVar211 = (float)(auVar74._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar49 * 0xd + 6);
  uVar100 = (undefined2)(uVar10 >> 0x30);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar10;
  auVar223._12_2_ = uVar100;
  auVar223._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar10 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar10;
  auVar222._10_2_ = uVar100;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar100;
  auVar221._0_8_ = uVar10;
  uVar100 = (undefined2)(uVar10 >> 0x10);
  auVar35._4_8_ = auVar221._8_8_;
  auVar35._2_2_ = uVar100;
  auVar35._0_2_ = uVar100;
  uVar11 = *(ulong *)(prim + uVar49 * 0x12 + 6);
  uVar100 = (undefined2)(uVar11 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar11;
  auVar79._12_2_ = uVar100;
  auVar79._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar11 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar11;
  auVar78._10_2_ = uVar100;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar100;
  auVar77._0_8_ = uVar11;
  uVar100 = (undefined2)(uVar11 >> 0x10);
  auVar36._4_8_ = auVar77._8_8_;
  auVar36._2_2_ = uVar100;
  auVar36._0_2_ = uVar100;
  fVar154 = (float)(auVar36._0_4_ >> 0x10);
  fVar212 = (float)(auVar77._8_4_ >> 0x10);
  uVar57 = (ulong)(uint)((int)(uVar49 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar49 * 2 + uVar57 + 6);
  uVar100 = (undefined2)(uVar12 >> 0x30);
  auVar235._8_4_ = 0;
  auVar235._0_8_ = uVar12;
  auVar235._12_2_ = uVar100;
  auVar235._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar12 >> 0x20);
  auVar234._12_4_ = auVar235._12_4_;
  auVar234._8_2_ = 0;
  auVar234._0_8_ = uVar12;
  auVar234._10_2_ = uVar100;
  auVar233._10_6_ = auVar234._10_6_;
  auVar233._8_2_ = uVar100;
  auVar233._0_8_ = uVar12;
  uVar100 = (undefined2)(uVar12 >> 0x10);
  auVar37._4_8_ = auVar233._8_8_;
  auVar37._2_2_ = uVar100;
  auVar37._0_2_ = uVar100;
  uVar57 = *(ulong *)(prim + uVar57 + 6);
  uVar100 = (undefined2)(uVar57 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar57;
  auVar82._12_2_ = uVar100;
  auVar82._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar57 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar57;
  auVar81._10_2_ = uVar100;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar100;
  auVar80._0_8_ = uVar57;
  uVar100 = (undefined2)(uVar57 >> 0x10);
  auVar38._4_8_ = auVar80._8_8_;
  auVar38._2_2_ = uVar100;
  auVar38._0_2_ = uVar100;
  fVar156 = (float)(auVar38._0_4_ >> 0x10);
  fVar213 = (float)(auVar80._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar49 * 0x18 + 6);
  uVar100 = (undefined2)(uVar13 >> 0x30);
  auVar244._8_4_ = 0;
  auVar244._0_8_ = uVar13;
  auVar244._12_2_ = uVar100;
  auVar244._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar13 >> 0x20);
  auVar243._12_4_ = auVar244._12_4_;
  auVar243._8_2_ = 0;
  auVar243._0_8_ = uVar13;
  auVar243._10_2_ = uVar100;
  auVar242._10_6_ = auVar243._10_6_;
  auVar242._8_2_ = uVar100;
  auVar242._0_8_ = uVar13;
  uVar100 = (undefined2)(uVar13 >> 0x10);
  auVar39._4_8_ = auVar242._8_8_;
  auVar39._2_2_ = uVar100;
  auVar39._0_2_ = uVar100;
  uVar14 = *(ulong *)(prim + uVar49 * 0x1d + 6);
  uVar100 = (undefined2)(uVar14 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar14;
  auVar85._12_2_ = uVar100;
  auVar85._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar14 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar14;
  auVar84._10_2_ = uVar100;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar100;
  auVar83._0_8_ = uVar14;
  uVar100 = (undefined2)(uVar14 >> 0x10);
  auVar40._4_8_ = auVar83._8_8_;
  auVar40._2_2_ = uVar100;
  auVar40._0_2_ = uVar100;
  fVar172 = (float)(auVar40._0_4_ >> 0x10);
  fVar217 = (float)(auVar83._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar49 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar100 = (undefined2)(uVar15 >> 0x30);
  auVar260._8_4_ = 0;
  auVar260._0_8_ = uVar15;
  auVar260._12_2_ = uVar100;
  auVar260._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar15 >> 0x20);
  auVar259._12_4_ = auVar260._12_4_;
  auVar259._8_2_ = 0;
  auVar259._0_8_ = uVar15;
  auVar259._10_2_ = uVar100;
  auVar258._10_6_ = auVar259._10_6_;
  auVar258._8_2_ = uVar100;
  auVar258._0_8_ = uVar15;
  uVar100 = (undefined2)(uVar15 >> 0x10);
  auVar41._4_8_ = auVar258._8_8_;
  auVar41._2_2_ = uVar100;
  auVar41._0_2_ = uVar100;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar49) + 6);
  uVar100 = (undefined2)(uVar16 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar16;
  auVar88._12_2_ = uVar100;
  auVar88._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar16 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar16;
  auVar87._10_2_ = uVar100;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar100;
  auVar86._0_8_ = uVar16;
  uVar100 = (undefined2)(uVar16 >> 0x10);
  auVar42._4_8_ = auVar86._8_8_;
  auVar42._2_2_ = uVar100;
  auVar42._0_2_ = uVar100;
  fVar173 = (float)(auVar42._0_4_ >> 0x10);
  fVar218 = (float)(auVar86._8_4_ >> 0x10);
  uVar49 = *(ulong *)(prim + uVar49 * 0x23 + 6);
  uVar100 = (undefined2)(uVar49 >> 0x30);
  auVar270._8_4_ = 0;
  auVar270._0_8_ = uVar49;
  auVar270._12_2_ = uVar100;
  auVar270._14_2_ = uVar100;
  uVar100 = (undefined2)(uVar49 >> 0x20);
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._8_2_ = 0;
  auVar269._0_8_ = uVar49;
  auVar269._10_2_ = uVar100;
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._8_2_ = uVar100;
  auVar268._0_8_ = uVar49;
  uVar100 = (undefined2)(uVar49 >> 0x10);
  auVar43._4_8_ = auVar268._8_8_;
  auVar43._2_2_ = uVar100;
  auVar43._0_2_ = uVar100;
  auVar161._0_8_ =
       CONCAT44(((((float)(auVar33._0_4_ >> 0x10) - fVar139) * fVar246 + fVar139) - fVar289) *
                fVar103,((((float)(int)(short)uVar54 - (float)(int)(short)uVar55) * fVar246 +
                         (float)(int)(short)uVar55) - fVar282) * fVar155);
  auVar161._8_4_ =
       ((((float)(auVar158._8_4_ >> 0x10) - fVar188) * fVar246 + fVar188) - fVar291) * fVar174;
  auVar161._12_4_ =
       ((((float)(auVar159._12_4_ >> 0x10) - (float)(auVar72._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar72._12_4_ >> 0x10)) - fVar293) * fVar219;
  auVar224._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar246 + (float)(int)(short)uVar9
        ) - fVar282) * fVar155;
  auVar224._4_4_ =
       ((((float)(auVar35._0_4_ >> 0x10) - fVar144) * fVar246 + fVar144) - fVar289) * fVar103;
  auVar224._8_4_ =
       ((((float)(auVar221._8_4_ >> 0x10) - fVar211) * fVar246 + fVar211) - fVar291) * fVar174;
  auVar224._12_4_ =
       ((((float)(auVar222._12_4_ >> 0x10) - (float)(auVar75._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar75._12_4_ >> 0x10)) - fVar293) * fVar219;
  auVar236._0_8_ =
       CONCAT44(((((float)(auVar37._0_4_ >> 0x10) - fVar154) * fVar246 + fVar154) - fVar238) *
                fVar106,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar246 +
                         (float)(int)(short)uVar11) - fVar232) * fVar67);
  auVar236._8_4_ =
       ((((float)(auVar233._8_4_ >> 0x10) - fVar212) * fVar246 + fVar212) - fVar239) * fVar183;
  auVar236._12_4_ =
       ((((float)(auVar234._12_4_ >> 0x10) - (float)(auVar78._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar78._12_4_ >> 0x10)) - fVar281) * fVar226;
  auVar245._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar57) * fVar246 +
        (float)(int)(short)uVar57) - fVar232) * fVar67;
  auVar245._4_4_ =
       ((((float)(auVar39._0_4_ >> 0x10) - fVar156) * fVar246 + fVar156) - fVar238) * fVar106;
  auVar245._8_4_ =
       ((((float)(auVar242._8_4_ >> 0x10) - fVar213) * fVar246 + fVar213) - fVar239) * fVar183;
  auVar245._12_4_ =
       ((((float)(auVar243._12_4_ >> 0x10) - (float)(auVar81._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar81._12_4_ >> 0x10)) - fVar281) * fVar226;
  auVar261._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar172) * fVar246 + fVar172) - fVar230) *
                fVar136,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar246 +
                         (float)(int)(short)uVar14) - fVar228) * fVar101);
  auVar261._8_4_ =
       ((((float)(auVar258._8_4_ >> 0x10) - fVar217) * fVar246 + fVar217) - fVar231) * fVar185;
  auVar261._12_4_ =
       ((((float)(auVar259._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar240) * fVar227;
  auVar271._0_4_ =
       ((((float)(int)(short)uVar49 - (float)(int)(short)uVar16) * fVar246 +
        (float)(int)(short)uVar16) - fVar228) * fVar101;
  auVar271._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar173) * fVar246 + fVar173) - fVar230) * fVar136;
  auVar271._8_4_ =
       ((((float)(auVar268._8_4_ >> 0x10) - fVar218) * fVar246 + fVar218) - fVar231) * fVar185;
  auVar271._12_4_ =
       ((((float)(auVar269._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar246 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar240) * fVar227;
  auVar145._8_4_ = auVar161._8_4_;
  auVar145._0_8_ = auVar161._0_8_;
  auVar145._12_4_ = auVar161._12_4_;
  auVar146 = minps(auVar145,auVar224);
  auVar89._8_4_ = auVar236._8_4_;
  auVar89._0_8_ = auVar236._0_8_;
  auVar89._12_4_ = auVar236._12_4_;
  auVar70 = minps(auVar89,auVar245);
  auVar146 = maxps(auVar146,auVar70);
  auVar90._8_4_ = auVar261._8_4_;
  auVar90._0_8_ = auVar261._0_8_;
  auVar90._12_4_ = auVar261._12_4_;
  auVar70 = minps(auVar90,auVar271);
  uVar295 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar118._4_4_ = uVar295;
  auVar118._0_4_ = uVar295;
  auVar118._8_4_ = uVar295;
  auVar118._12_4_ = uVar295;
  auVar70 = maxps(auVar70,auVar118);
  auVar70 = maxps(auVar146,auVar70);
  local_48 = auVar70._0_4_ * 0.99999964;
  fStack_44 = auVar70._4_4_ * 0.99999964;
  fStack_40 = auVar70._8_4_ * 0.99999964;
  fStack_3c = auVar70._12_4_ * 0.99999964;
  auVar70 = maxps(auVar161,auVar224);
  auVar146 = maxps(auVar236,auVar245);
  auVar70 = minps(auVar70,auVar146);
  auVar146 = maxps(auVar261,auVar271);
  fVar155 = (ray->super_RayK<1>).tfar;
  auVar91._4_4_ = fVar155;
  auVar91._0_4_ = fVar155;
  auVar91._8_4_ = fVar155;
  auVar91._12_4_ = fVar155;
  auVar146 = minps(auVar146,auVar91);
  auVar70 = minps(auVar70,auVar146);
  uVar60 = (uint)(byte)PVar17;
  auVar119._0_4_ = -(uint)(uVar60 != 0 && local_48 <= auVar70._0_4_ * 1.0000004);
  auVar119._4_4_ = -(uint)(1 < uVar60 && fStack_44 <= auVar70._4_4_ * 1.0000004);
  auVar119._8_4_ = -(uint)(2 < uVar60 && fStack_40 <= auVar70._8_4_ * 1.0000004);
  auVar119._12_4_ = -(uint)(3 < uVar60 && fStack_3c <= auVar70._12_4_ * 1.0000004);
  uVar60 = movmskps(uVar60,auVar119);
  if (uVar60 != 0) {
    uVar60 = uVar60 & 0xff;
    local_2e8 = mm_lookupmask_ps._0_8_;
    uStack_2e0 = mm_lookupmask_ps._8_8_;
    local_320 = pre;
    local_160 = prim;
    do {
      lVar20 = 0;
      if (uVar60 != 0) {
        for (; (uVar60 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      local_3c0 = (RTCIntersectArguments *)(ulong)*(uint *)(local_160 + 2);
      local_390 = (ulong)*(uint *)(local_160 + lVar20 * 4 + 6);
      pGVar56 = (context->scene->geometries).items[(long)local_3c0].ptr;
      uVar55 = (ulong)*(uint *)(*(long *)&pGVar56->field_0x58 +
                               local_390 *
                               pGVar56[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      local_3e8 = pGVar56->fnumTimeSegments;
      fVar155 = (pGVar56->time_range).lower;
      fVar155 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar155) /
                ((pGVar56->time_range).upper - fVar155)) * pGVar56->fnumTimeSegments;
      _local_3d8 = ZEXT416((uint)fVar155);
      fVar155 = floorf(fVar155);
      if (local_3e8 + -1.0 <= fVar155) {
        fVar155 = local_3e8 + -1.0;
      }
      fVar67 = 0.0;
      if (0.0 <= fVar155) {
        fVar67 = fVar155;
      }
      _Var19 = pGVar56[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      uVar54 = (long)(int)fVar67 * 0x38;
      lVar20 = *(long *)(_Var19 + 0x10 + uVar54);
      lVar59 = *(long *)(_Var19 + 0x38 + uVar54);
      lVar58 = *(long *)(_Var19 + 0x48 + uVar54);
      pfVar1 = (float *)(lVar59 + uVar55 * lVar58);
      pfVar2 = (float *)(lVar59 + (uVar55 + 1) * lVar58);
      pfVar3 = (float *)(lVar59 + (uVar55 + 2) * lVar58);
      fVar67 = (float)local_3d8._0_4_ - fVar67;
      fVar155 = 1.0 - fVar67;
      pfVar4 = (float *)(lVar59 + lVar58 * (uVar55 + 3));
      lVar59 = *(long *)(_Var19 + uVar54);
      pfVar5 = (float *)(lVar59 + lVar20 * uVar55);
      pfVar6 = (float *)(lVar59 + lVar20 * (uVar55 + 1));
      local_2d8 = *pfVar5 * fVar155 + *pfVar1 * fVar67;
      fStack_2d4 = pfVar5[1] * fVar155 + pfVar1[1] * fVar67;
      fStack_2d0 = pfVar5[2] * fVar155 + pfVar1[2] * fVar67;
      fStack_2cc = pfVar5[3] * fVar155 + pfVar1[3] * fVar67;
      fVar218 = *pfVar6 * fVar155 + *pfVar2 * fVar67;
      fVar219 = pfVar6[1] * fVar155 + pfVar2[1] * fVar67;
      fVar226 = pfVar6[2] * fVar155 + pfVar2[2] * fVar67;
      fStack_21c = pfVar6[3] * fVar155 + pfVar2[3] * fVar67;
      pfVar1 = (float *)(lVar59 + lVar20 * (uVar55 + 2));
      local_238 = *pfVar1 * fVar155 + *pfVar3 * fVar67;
      fStack_234 = pfVar1[1] * fVar155 + pfVar3[1] * fVar67;
      fStack_230 = pfVar1[2] * fVar155 + pfVar3[2] * fVar67;
      fStack_22c = pfVar1[3] * fVar155 + pfVar3[3] * fVar67;
      pfVar1 = (float *)(lVar59 + lVar20 * (uVar55 + 3));
      local_218 = fVar155 * *pfVar1 + fVar67 * *pfVar4;
      fStack_214 = fVar155 * pfVar1[1] + fVar67 * pfVar4[1];
      fStack_210 = fVar155 * pfVar1[2] + fVar67 * pfVar4[2];
      fStack_20c = fVar155 * pfVar1[3] + fVar67 * pfVar4[3];
      iVar18 = (int)pGVar56[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar155 = (ray->super_RayK<1>).org.field_0.m128[0];
      fVar67 = (ray->super_RayK<1>).org.field_0.m128[1];
      fVar101 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar188 = local_2d8 - fVar155;
      fVar211 = fStack_2d4 - fVar67;
      fVar212 = fStack_2d0 - fVar101;
      fVar103 = (local_320->ray_space).vx.field_0.m128[0];
      fVar106 = (local_320->ray_space).vx.field_0.m128[1];
      fVar136 = (local_320->ray_space).vx.field_0.m128[2];
      fVar139 = (local_320->ray_space).vx.field_0.m128[3];
      fVar144 = (local_320->ray_space).vy.field_0.m128[0];
      fVar154 = (local_320->ray_space).vy.field_0.m128[1];
      fVar156 = (local_320->ray_space).vy.field_0.m128[2];
      fVar172 = (local_320->ray_space).vy.field_0.m128[3];
      fVar173 = (local_320->ray_space).vz.field_0.m128[0];
      fVar174 = (local_320->ray_space).vz.field_0.m128[1];
      fVar183 = (local_320->ray_space).vz.field_0.m128[2];
      fVar185 = (local_320->ray_space).vz.field_0.m128[3];
      local_288 = fVar188 * fVar103 + fVar211 * fVar144 + fVar212 * fVar173;
      local_178 = fVar188 * fVar106 + fVar211 * fVar154 + fVar212 * fVar174;
      local_3d8._4_4_ = fVar188 * fVar136 + fVar211 * fVar156 + fVar212 * fVar183;
      fVar188 = fVar218 - fVar155;
      fVar211 = fVar219 - fVar67;
      fVar212 = fVar226 - fVar101;
      local_198 = fVar188 * fVar103 + fVar211 * fVar144 + fVar212 * fVar173;
      local_1a8 = fVar188 * fVar106 + fVar211 * fVar154 + fVar212 * fVar174;
      local_2c8 = fVar188 * fVar136 + fVar211 * fVar156 + fVar212 * fVar183;
      fVar212 = local_238 - fVar155;
      fVar213 = fStack_234 - fVar67;
      fVar217 = fStack_230 - fVar101;
      local_3a8 = fVar212 * fVar103 + fVar213 * fVar144 + fVar217 * fVar173;
      fVar211 = fVar212 * fVar106 + fVar213 * fVar154 + fVar217 * fVar174;
      fVar188 = fVar212 * fVar136 + fVar213 * fVar156 + fVar217 * fVar183;
      fStack_3ac = fVar212 * fVar139 + fVar213 * fVar172 + fVar217 * fVar185;
      fVar155 = local_218 - fVar155;
      fVar67 = fStack_214 - fVar67;
      fVar101 = fStack_210 - fVar101;
      uVar295 = fVar155 * fVar103 + fVar67 * fVar144 + fVar101 * fVar173;
      local_418 = fVar155 * fVar106 + fVar67 * fVar154 + fVar101 * fVar174;
      fVar103 = fVar155 * fVar136 + fVar67 * fVar156 + fVar101 * fVar183;
      fStack_3ec = fVar155 * fVar139 + fVar67 * fVar172 + fVar101 * fVar185;
      auVar272._0_8_ = CONCAT44(local_178,local_288) & 0x7fffffff7fffffff;
      auVar272._8_4_ = ABS((float)local_3d8._4_4_);
      auVar272._12_4_ = ABS(fStack_2cc);
      auVar175._0_8_ = CONCAT44(local_1a8,local_198) & 0x7fffffff7fffffff;
      auVar175._8_4_ = ABS(local_2c8);
      auVar175._12_4_ = ABS(fStack_21c);
      auVar146 = maxps(auVar272,auVar175);
      auVar205._0_8_ = CONCAT44(fVar211,local_3a8) & 0x7fffffff7fffffff;
      auVar205._8_4_ = ABS(fVar188);
      auVar205._12_4_ = ABS(fStack_22c);
      auVar120._0_8_ = CONCAT44(local_418,uVar295) & 0x7fffffff7fffffff;
      auVar120._8_4_ = ABS(fVar103);
      auVar120._12_4_ = ABS(fStack_20c);
      auVar70 = maxps(auVar205,auVar120);
      auVar70 = maxps(auVar146,auVar70);
      fVar155 = auVar70._4_4_;
      if (auVar70._4_4_ <= auVar70._0_4_) {
        fVar155 = auVar70._0_4_;
      }
      auVar273._8_8_ = auVar70._8_8_;
      auVar273._0_8_ = auVar70._8_8_;
      fVar67 = (float)iVar18;
      if (auVar70._8_4_ <= fVar155) {
        auVar273._0_4_ = fVar155;
      }
      _local_248 = ZEXT416((uint)fVar67);
      local_438._4_4_ = -(uint)(1.0 < fVar67);
      local_438._0_4_ = -(uint)(0.0 < fVar67);
      local_438._8_4_ = -(uint)(2.0 < fVar67);
      local_438._12_4_ = -(uint)(3.0 < fVar67);
      pRVar53 = (RTCIntersectArguments *)((long)iVar18 * 0x40);
      uVar52 = SUB84(pRVar53,0);
      lVar20 = (long)iVar18 * 0x44;
      pauVar8 = (undefined1 (*) [16])(bspline_basis0 + lVar20 + 0x908);
      fVar155 = *(float *)*pauVar8;
      fVar101 = *(float *)(bspline_basis0 + lVar20 + 0x90c);
      fVar106 = *(float *)(bspline_basis0 + lVar20 + 0x910);
      auVar23 = *(undefined1 (*) [12])*pauVar8;
      fVar136 = *(float *)(bspline_basis0 + lVar20 + 0x914);
      _local_2a8 = *pauVar8;
      fStack_3a4 = local_3a8;
      fStack_3a0 = local_3a8;
      fStack_39c = local_3a8;
      fVar139 = *(float *)(bspline_basis0 + lVar20 + 0xd8c);
      fVar144 = *(float *)(bspline_basis0 + lVar20 + 0xd90);
      fVar154 = *(float *)(bspline_basis0 + lVar20 + 0xd94);
      fVar156 = *(float *)(bspline_basis0 + lVar20 + 0xd98);
      local_44c.m128[1] = (float)uVar295;
      local_44c.m128[2] = (float)uVar295;
      local_44c.m128[3] = (float)uVar295;
      fStack_43c = (float)uVar295;
      local_188 = fStack_22c;
      fStack_184 = fStack_22c;
      fStack_180 = fStack_22c;
      fStack_17c = fStack_22c;
      local_368 = *(float *)(bspline_basis0 + lVar20 + 0x484);
      fStack_364 = *(float *)(bspline_basis0 + lVar20 + 0x488);
      fStack_360 = *(float *)(bspline_basis0 + lVar20 + 0x48c);
      fStack_35c = *(float *)(bspline_basis0 + lVar20 + 0x490);
      local_228 = fVar218;
      fStack_224 = fVar219;
      fStack_220 = fVar226;
      local_2b8 = *(float *)(bspline_basis0 + lVar20);
      fStack_2b4 = *(float *)(bspline_basis0 + lVar20 + 4);
      fStack_2b0 = *(float *)(bspline_basis0 + lVar20 + 8);
      fStack_2ac = *(float *)(bspline_basis0 + lVar20 + 0xc);
      local_1c8 = local_288 * local_2b8 +
                  local_198 * local_368 + local_3a8 * fVar155 + (float)uVar295 * fVar139;
      fStack_1c4 = local_288 * fStack_2b4 +
                   local_198 * fStack_364 + local_3a8 * fVar101 + (float)uVar295 * fVar144;
      fStack_1c0 = local_288 * fStack_2b0 +
                   local_198 * fStack_360 + local_3a8 * fVar106 + (float)uVar295 * fVar154;
      fStack_1bc = local_288 * fStack_2ac +
                   local_198 * fStack_35c + local_3a8 * fVar136 + (float)uVar295 * fVar156;
      local_1b8 = local_178 * local_2b8 +
                  local_1a8 * local_368 + fVar211 * fVar155 + local_418 * fVar139;
      fStack_1b4 = local_178 * fStack_2b4 +
                   local_1a8 * fStack_364 + fVar211 * fVar101 + local_418 * fVar144;
      fStack_1b0 = local_178 * fStack_2b0 +
                   local_1a8 * fStack_360 + fVar211 * fVar106 + local_418 * fVar154;
      fStack_1ac = local_178 * fStack_2ac +
                   local_1a8 * fStack_35c + fVar211 * fVar136 + local_418 * fVar156;
      local_428._0_4_ =
           fStack_2cc * local_2b8 +
           fStack_21c * local_368 + fStack_22c * fVar155 + fStack_20c * fVar139;
      local_428._4_4_ =
           fStack_2cc * fStack_2b4 +
           fStack_21c * fStack_364 + fStack_22c * fVar101 + fStack_20c * fVar144;
      uStack_420._0_4_ =
           fStack_2cc * fStack_2b0 +
           fStack_21c * fStack_360 + fStack_22c * fVar106 + fStack_20c * fVar154;
      register0x0000150c =
           fStack_2cc * fStack_2ac +
           fStack_21c * fStack_35c + fStack_22c * fVar136 + fStack_20c * fVar156;
      fVar101 = *(float *)(bspline_basis1 + lVar20 + 0xd8c);
      fVar106 = *(float *)(bspline_basis1 + lVar20 + 0xd90);
      fVar172 = *(float *)(bspline_basis1 + lVar20 + 0xd94);
      fVar173 = *(float *)(bspline_basis1 + lVar20 + 0xd98);
      fVar174 = *(float *)(bspline_basis1 + lVar20 + 0x908);
      fVar183 = *(float *)(bspline_basis1 + lVar20 + 0x90c);
      fVar185 = *(float *)(bspline_basis1 + lVar20 + 0x910);
      fVar212 = *(float *)(bspline_basis1 + lVar20 + 0x914);
      fStack_414 = local_418;
      fStack_410 = local_418;
      fStack_40c = local_418;
      local_58 = fStack_20c;
      fStack_54 = fStack_20c;
      fStack_50 = fStack_20c;
      fStack_4c = fStack_20c;
      fVar213 = *(float *)(bspline_basis1 + lVar20 + 0x484);
      fVar217 = *(float *)(bspline_basis1 + lVar20 + 0x488);
      fVar227 = *(float *)(bspline_basis1 + lVar20 + 0x48c);
      fVar232 = *(float *)(bspline_basis1 + lVar20 + 0x490);
      fStack_194 = local_198;
      fStack_190 = local_198;
      fStack_18c = local_198;
      fStack_1a4 = local_1a8;
      fStack_1a0 = local_1a8;
      fStack_19c = local_1a8;
      local_88 = fStack_21c;
      fStack_84 = fStack_21c;
      fStack_80 = fStack_21c;
      fStack_7c = fStack_21c;
      fVar238 = *(float *)(bspline_basis1 + lVar20);
      fVar239 = *(float *)(bspline_basis1 + lVar20 + 4);
      fVar281 = *(float *)(bspline_basis1 + lVar20 + 8);
      fVar228 = *(float *)(bspline_basis1 + lVar20 + 0xc);
      fStack_284 = local_288;
      fStack_280 = local_288;
      fStack_27c = local_288;
      local_298 = local_288 * fVar238 +
                  local_198 * fVar213 + local_3a8 * fVar174 + (float)uVar295 * fVar101;
      fStack_294 = local_288 * fVar239 +
                   local_198 * fVar217 + local_3a8 * fVar183 + (float)uVar295 * fVar106;
      fStack_290 = local_288 * fVar281 +
                   local_198 * fVar227 + local_3a8 * fVar185 + (float)uVar295 * fVar172;
      fStack_28c = local_288 * fVar228 +
                   local_198 * fVar232 + local_3a8 * fVar212 + (float)uVar295 * fVar173;
      fStack_174 = local_178;
      fStack_170 = local_178;
      fStack_16c = local_178;
      fVar279 = local_178 * fVar238 + local_1a8 * fVar213 + fVar211 * fVar174 + local_418 * fVar101;
      fVar282 = local_178 * fVar239 + local_1a8 * fVar217 + fVar211 * fVar183 + local_418 * fVar106;
      fVar289 = local_178 * fVar281 + local_1a8 * fVar227 + fVar211 * fVar185 + local_418 * fVar172;
      fVar291 = local_178 * fVar228 + local_1a8 * fVar232 + fVar211 * fVar212 + local_418 * fVar173;
      local_98 = fStack_2cc;
      fStack_94 = fStack_2cc;
      fStack_90 = fStack_2cc;
      fStack_8c = fStack_2cc;
      auVar225._0_4_ =
           fStack_2cc * fVar238 + fStack_21c * fVar213 + fStack_22c * fVar174 + fStack_20c * fVar101
      ;
      auVar225._4_4_ =
           fStack_2cc * fVar239 + fStack_21c * fVar217 + fStack_22c * fVar183 + fStack_20c * fVar106
      ;
      auVar225._8_4_ =
           fStack_2cc * fVar281 + fStack_21c * fVar227 + fStack_22c * fVar185 + fStack_20c * fVar172
      ;
      auVar225._12_4_ =
           fStack_2cc * fVar228 + fStack_21c * fVar232 + fStack_22c * fVar212 + fStack_20c * fVar173
      ;
      fVar293 = local_298 - local_1c8;
      fVar184 = fStack_294 - fStack_1c4;
      fVar186 = fStack_290 - fStack_1c0;
      fVar187 = fStack_28c - fStack_1bc;
      local_408 = CONCAT44(fVar282,fVar279);
      uStack_400 = CONCAT44(fVar291,fVar289);
      fVar265 = fVar279 - local_1b8;
      fVar266 = fVar282 - fStack_1b4;
      fVar276 = fVar289 - fStack_1b0;
      fVar277 = fVar291 - fStack_1ac;
      fVar155 = local_1b8 * fVar293 - local_1c8 * fVar265;
      fVar230 = fStack_1b4 * fVar184 - fStack_1c4 * fVar266;
      fVar231 = fStack_1b0 * fVar186 - fStack_1c0 * fVar276;
      fVar240 = fStack_1ac * fVar187 - fStack_1bc * fVar277;
      auVar70 = maxps(_local_428,auVar225);
      bVar46 = fVar155 * fVar155 <=
               auVar70._0_4_ * auVar70._0_4_ * (fVar293 * fVar293 + fVar265 * fVar265) &&
               0.0 < fVar67;
      auVar206._0_4_ = -(uint)bVar46;
      bVar47 = fVar230 * fVar230 <=
               auVar70._4_4_ * auVar70._4_4_ * (fVar184 * fVar184 + fVar266 * fVar266) &&
               1.0 < fVar67;
      auVar206._4_4_ = -(uint)bVar47;
      bVar45 = fVar231 * fVar231 <=
               auVar70._8_4_ * auVar70._8_4_ * (fVar186 * fVar186 + fVar276 * fVar276) &&
               2.0 < fVar67;
      auVar206._8_4_ = -(uint)bVar45;
      bVar44 = fVar240 * fVar240 <=
               auVar70._12_4_ * auVar70._12_4_ * (fVar187 * fVar187 + fVar277 * fVar277) &&
               3.0 < fVar67;
      auVar206._12_4_ = -(uint)bVar44;
      local_3e8 = auVar273._0_4_;
      fStack_3e4 = auVar273._4_4_;
      fStack_3e0 = auVar273._8_4_;
      fStack_3dc = auVar273._12_4_;
      fVar230 = local_3e8 * 4.7683716e-07;
      local_3e8 = fVar230;
      iVar48 = movmskps(iVar18,auVar206);
      fVar155 = (ray->super_RayK<1>).org.field_0.m128[3];
      _local_208 = ZEXT416((uint)fVar155);
      local_3d8._0_4_ = local_3d8._4_4_;
      fStack_3d0 = (float)local_3d8._4_4_;
      fStack_3cc = (float)local_3d8._4_4_;
      fStack_2c4 = local_2c8;
      fStack_2c0 = local_2c8;
      fStack_2bc = local_2c8;
      fVar231 = fVar188;
      fVar240 = fVar188;
      fVar246 = fVar188;
      uVar249 = uVar295;
      uVar253 = uVar295;
      fVar250 = (float)uVar295;
      fVar256 = fVar103;
      fVar263 = fVar103;
      fVar264 = fVar103;
      local_3f8 = (float)uVar295;
      fStack_3f4 = local_418;
      fStack_3f0 = fVar103;
      local_3b8 = local_3a8;
      fStack_3b4 = fVar211;
      fStack_3b0 = fVar188;
      if (iVar48 != 0) {
        local_1e8._4_4_ = fVar266;
        local_1e8._0_4_ = fVar265;
        fStack_1e0 = fVar276;
        fStack_1dc = fVar277;
        fVar68 = fVar101 * fVar103 + fVar174 * fVar188 + fVar213 * local_2c8 +
                 fVar238 * (float)local_3d8._4_4_;
        fVar102 = fVar106 * fVar103 + fVar183 * fVar188 + fVar217 * local_2c8 +
                  fVar239 * (float)local_3d8._4_4_;
        fVar104 = fVar172 * fVar103 + fVar185 * fVar188 + fVar227 * local_2c8 +
                  fVar281 * (float)local_3d8._4_4_;
        fVar105 = fVar173 * fVar103 + fVar212 * fVar188 + fVar232 * local_2c8 +
                  fVar228 * (float)local_3d8._4_4_;
        local_2a8._0_4_ = auVar23._0_4_;
        local_2a8._4_4_ = auVar23._4_4_;
        fStack_2a0 = auVar23._8_4_;
        fVar101 = (float)local_2a8._0_4_ * fVar188;
        fVar106 = (float)local_2a8._4_4_ * fVar188;
        fVar172 = fStack_2a0 * fVar188;
        _local_2a8 = auVar206;
        fVar107 = fVar139 * fVar103 + fVar101 + local_368 * local_2c8 +
                  local_2b8 * (float)local_3d8._4_4_;
        fVar137 = fVar144 * fVar103 + fVar106 + fStack_364 * local_2c8 +
                  fStack_2b4 * (float)local_3d8._4_4_;
        fVar140 = fVar154 * fVar103 + fVar172 + fStack_360 * local_2c8 +
                  fStack_2b0 * (float)local_3d8._4_4_;
        fVar142 = fVar156 * fVar103 + fVar136 * fVar188 + fStack_35c * local_2c8 +
                  fStack_2ac * (float)local_3d8._4_4_;
        fVar101 = *(float *)(bspline_basis0 + lVar20 + 0x1210);
        fVar106 = *(float *)(bspline_basis0 + lVar20 + 0x1214);
        fVar136 = *(float *)(bspline_basis0 + lVar20 + 0x1218);
        fVar139 = *(float *)(bspline_basis0 + lVar20 + 0x121c);
        fVar144 = *(float *)(bspline_basis0 + lVar20 + 0x1694);
        fVar154 = *(float *)(bspline_basis0 + lVar20 + 0x1698);
        fVar156 = *(float *)(bspline_basis0 + lVar20 + 0x169c);
        fVar172 = *(float *)(bspline_basis0 + lVar20 + 0x16a0);
        fVar173 = *(float *)(bspline_basis0 + lVar20 + 0x1b18);
        fVar174 = *(float *)(bspline_basis0 + lVar20 + 0x1b1c);
        fVar183 = *(float *)(bspline_basis0 + lVar20 + 0x1b20);
        fVar185 = *(float *)(bspline_basis0 + lVar20 + 0x1b24);
        fVar212 = *(float *)(bspline_basis0 + lVar20 + 0x1f9c);
        fVar213 = *(float *)(bspline_basis0 + lVar20 + 0x1fa0);
        fVar217 = *(float *)(bspline_basis0 + lVar20 + 0x1fa4);
        fVar227 = *(float *)(bspline_basis0 + lVar20 + 0x1fa8);
        local_3f8 = fVar103;
        fStack_3f4 = fVar103;
        fStack_3ec = fVar103;
        local_3b8 = fVar188;
        fStack_3b4 = fVar188;
        fStack_3ac = fVar188;
        fVar241 = local_288 * fVar101 +
                  local_198 * fVar144 + local_3a8 * fVar173 + (float)uVar295 * fVar212;
        fVar247 = local_288 * fVar106 +
                  local_198 * fVar154 + local_3a8 * fVar174 + (float)uVar295 * fVar213;
        fVar251 = local_288 * fVar136 +
                  local_198 * fVar156 + local_3a8 * fVar183 + (float)uVar295 * fVar217;
        fVar254 = local_288 * fVar139 +
                  local_198 * fVar172 + local_3a8 * fVar185 + (float)uVar295 * fVar227;
        fVar302 = local_178 * fVar101 +
                  local_1a8 * fVar144 + fVar211 * fVar173 + local_418 * fVar212;
        fVar304 = local_178 * fVar106 +
                  local_1a8 * fVar154 + fVar211 * fVar174 + local_418 * fVar213;
        fVar306 = local_178 * fVar136 +
                  local_1a8 * fVar156 + fVar211 * fVar183 + local_418 * fVar217;
        fVar307 = local_178 * fVar139 +
                  local_1a8 * fVar172 + fVar211 * fVar185 + local_418 * fVar227;
        fVar232 = *(float *)(bspline_basis1 + lVar20 + 0x1210);
        fVar238 = *(float *)(bspline_basis1 + lVar20 + 0x1214);
        fVar239 = *(float *)(bspline_basis1 + lVar20 + 0x1218);
        fVar281 = *(float *)(bspline_basis1 + lVar20 + 0x121c);
        fVar228 = *(float *)(bspline_basis1 + lVar20 + 0x1b18);
        fVar248 = *(float *)(bspline_basis1 + lVar20 + 0x1b1c);
        fVar252 = *(float *)(bspline_basis1 + lVar20 + 0x1b20);
        fVar255 = *(float *)(bspline_basis1 + lVar20 + 0x1b24);
        fVar278 = *(float *)(bspline_basis1 + lVar20 + 0x1f9c);
        fVar280 = *(float *)(bspline_basis1 + lVar20 + 0x1fa0);
        fVar283 = *(float *)(bspline_basis1 + lVar20 + 0x1fa4);
        fVar290 = *(float *)(bspline_basis1 + lVar20 + 0x1fa8);
        local_438 = auVar225;
        fVar292 = *(float *)(bspline_basis1 + lVar20 + 0x1694);
        fVar294 = *(float *)(bspline_basis1 + lVar20 + 0x1698);
        fVar303 = *(float *)(bspline_basis1 + lVar20 + 0x169c);
        fVar305 = *(float *)(bspline_basis1 + lVar20 + 0x16a0);
        auVar176._0_4_ = local_198 * fVar292 + local_3a8 * fVar228 + (float)uVar295 * fVar278;
        auVar176._4_4_ = local_198 * fVar294 + local_3a8 * fVar248 + (float)uVar295 * fVar280;
        auVar176._8_4_ = local_198 * fVar303 + local_3a8 * fVar252 + (float)uVar295 * fVar283;
        auVar176._12_4_ = local_198 * fVar305 + local_3a8 * fVar255 + (float)uVar295 * fVar290;
        fVar296 = local_288 * fVar232 + auVar176._0_4_;
        fVar299 = local_288 * fVar238 + auVar176._4_4_;
        fVar300 = local_288 * fVar239 + auVar176._8_4_;
        fVar301 = local_288 * fVar281 + auVar176._12_4_;
        fVar108 = local_178 * fVar232 +
                  local_1a8 * fVar292 + fVar211 * fVar228 + local_418 * fVar278;
        fVar138 = local_178 * fVar238 +
                  local_1a8 * fVar294 + fVar211 * fVar248 + local_418 * fVar280;
        fVar141 = local_178 * fVar239 +
                  local_1a8 * fVar303 + fVar211 * fVar252 + local_418 * fVar283;
        fVar143 = local_178 * fVar281 +
                  local_1a8 * fVar305 + fVar211 * fVar255 + local_418 * fVar290;
        auVar274._0_8_ = CONCAT44(fVar247,fVar241) & 0x7fffffff7fffffff;
        auVar274._8_4_ = ABS(fVar251);
        auVar274._12_4_ = ABS(fVar254);
        auVar229._0_8_ = CONCAT44(fVar304,fVar302) & 0x7fffffff7fffffff;
        auVar229._8_4_ = ABS(fVar306);
        auVar229._12_4_ = ABS(fVar307);
        auVar70 = maxps(auVar274,auVar229);
        auVar284._0_8_ =
             CONCAT44(fVar106 * (float)local_3d8._4_4_ +
                      fVar154 * local_2c8 + fVar174 * fVar188 + fVar213 * fVar103,
                      fVar101 * (float)local_3d8._4_4_ +
                      fVar144 * local_2c8 + fVar173 * fVar188 + fVar212 * fVar103) &
             0x7fffffff7fffffff;
        auVar284._8_4_ =
             ABS(fVar136 * (float)local_3d8._4_4_ +
                 fVar156 * local_2c8 + fVar183 * fVar188 + fVar217 * fVar103);
        auVar284._12_4_ =
             ABS(fVar139 * (float)local_3d8._4_4_ +
                 fVar172 * local_2c8 + fVar185 * fVar188 + fVar227 * fVar103);
        auVar70 = maxps(auVar70,auVar284);
        uVar61 = -(uint)(fVar230 <= auVar70._0_4_);
        uVar62 = -(uint)(fVar230 <= auVar70._4_4_);
        uVar63 = -(uint)(fVar230 <= auVar70._8_4_);
        uVar64 = -(uint)(fVar230 <= auVar70._12_4_);
        fVar144 = (float)((uint)fVar241 & uVar61 | ~uVar61 & (uint)fVar293);
        fVar156 = (float)((uint)fVar247 & uVar62 | ~uVar62 & (uint)fVar184);
        fVar183 = (float)((uint)fVar251 & uVar63 | ~uVar63 & (uint)fVar186);
        fVar185 = (float)((uint)fVar254 & uVar64 | ~uVar64 & (uint)fVar187);
        fVar212 = (float)(~uVar61 & (uint)fVar265 | (uint)fVar302 & uVar61);
        fVar213 = (float)(~uVar62 & (uint)fVar266 | (uint)fVar304 & uVar62);
        fVar217 = (float)(~uVar63 & (uint)fVar276 | (uint)fVar306 & uVar63);
        fVar227 = (float)(~uVar64 & (uint)fVar277 | (uint)fVar307 & uVar64);
        auVar285._0_8_ = CONCAT44(fVar299,fVar296) & 0x7fffffff7fffffff;
        auVar285._8_4_ = ABS(fVar300);
        auVar285._12_4_ = ABS(fVar301);
        auVar237._0_8_ = CONCAT44(fVar138,fVar108) & 0x7fffffff7fffffff;
        auVar237._8_4_ = ABS(fVar141);
        auVar237._12_4_ = ABS(fVar143);
        auVar70 = maxps(auVar285,auVar237);
        auVar215._0_8_ =
             CONCAT44(fVar238 * (float)local_3d8._4_4_ +
                      fVar294 * local_2c8 + fVar248 * fVar188 + fVar280 * fVar103,
                      fVar232 * (float)local_3d8._4_4_ +
                      fVar292 * local_2c8 + fVar228 * fVar188 + fVar278 * fVar103) &
             0x7fffffff7fffffff;
        auVar215._8_4_ =
             ABS(fVar239 * (float)local_3d8._4_4_ +
                 fVar303 * local_2c8 + fVar252 * fVar188 + fVar283 * fVar103);
        auVar215._12_4_ =
             ABS(fVar281 * (float)local_3d8._4_4_ +
                 fVar305 * local_2c8 + fVar255 * fVar188 + fVar290 * fVar103);
        auVar70 = maxps(auVar70,auVar215);
        uVar61 = -(uint)(fVar230 <= auVar70._0_4_);
        uVar62 = -(uint)(fVar230 <= auVar70._4_4_);
        uVar63 = -(uint)(fVar230 <= auVar70._8_4_);
        uVar64 = -(uint)(fVar230 <= auVar70._12_4_);
        fVar248 = (float)((uint)fVar296 & uVar61 | ~uVar61 & (uint)fVar293);
        fVar252 = (float)((uint)fVar299 & uVar62 | ~uVar62 & (uint)fVar184);
        fVar255 = (float)((uint)fVar300 & uVar63 | ~uVar63 & (uint)fVar186);
        fVar187 = (float)((uint)fVar301 & uVar64 | ~uVar64 & (uint)fVar187);
        fVar232 = (float)(~uVar61 & (uint)fVar265 | (uint)fVar108 & uVar61);
        fVar239 = (float)(~uVar62 & (uint)fVar266 | (uint)fVar138 & uVar62);
        fVar228 = (float)(~uVar63 & (uint)fVar276 | (uint)fVar141 & uVar63);
        fVar265 = (float)(~uVar64 & (uint)fVar277 | (uint)fVar143 & uVar64);
        auVar121._0_4_ = fVar212 * fVar212 + fVar144 * fVar144;
        auVar121._4_4_ = fVar213 * fVar213 + fVar156 * fVar156;
        auVar121._8_4_ = fVar217 * fVar217 + fVar183 * fVar183;
        auVar121._12_4_ = fVar227 * fVar227 + fVar185 * fVar185;
        auVar70 = rsqrtps(auVar176,auVar121);
        fVar101 = auVar70._0_4_;
        fVar106 = auVar70._4_4_;
        fVar136 = auVar70._8_4_;
        fVar139 = auVar70._12_4_;
        auVar177._0_4_ = fVar101 * fVar101 * auVar121._0_4_ * 0.5 * fVar101;
        auVar177._4_4_ = fVar106 * fVar106 * auVar121._4_4_ * 0.5 * fVar106;
        auVar177._8_4_ = fVar136 * fVar136 * auVar121._8_4_ * 0.5 * fVar136;
        auVar177._12_4_ = fVar139 * fVar139 * auVar121._12_4_ * 0.5 * fVar139;
        fVar266 = fVar101 * 1.5 - auVar177._0_4_;
        fVar276 = fVar106 * 1.5 - auVar177._4_4_;
        fVar277 = fVar136 * 1.5 - auVar177._8_4_;
        fVar293 = fVar139 * 1.5 - auVar177._12_4_;
        auVar122._0_4_ = fVar232 * fVar232 + fVar248 * fVar248;
        auVar122._4_4_ = fVar239 * fVar239 + fVar252 * fVar252;
        auVar122._8_4_ = fVar228 * fVar228 + fVar255 * fVar255;
        auVar122._12_4_ = fVar265 * fVar265 + fVar187 * fVar187;
        auVar70 = rsqrtps(auVar177,auVar122);
        fVar101 = auVar70._0_4_;
        fVar106 = auVar70._4_4_;
        fVar136 = auVar70._8_4_;
        fVar139 = auVar70._12_4_;
        fVar154 = fVar101 * 1.5 - fVar101 * fVar101 * auVar122._0_4_ * 0.5 * fVar101;
        fVar172 = fVar106 * 1.5 - fVar106 * fVar106 * auVar122._4_4_ * 0.5 * fVar106;
        fVar173 = fVar136 * 1.5 - fVar136 * fVar136 * auVar122._8_4_ * 0.5 * fVar136;
        fVar174 = fVar139 * 1.5 - fVar139 * fVar139 * auVar122._12_4_ * 0.5 * fVar139;
        fVar238 = fVar212 * fVar266 * (float)local_428._0_4_;
        fVar281 = fVar213 * fVar276 * (float)local_428._4_4_;
        fVar278 = fVar217 * fVar277 * (float)uStack_420;
        fVar280 = fVar227 * fVar293 * register0x0000150c;
        fVar101 = -fVar144 * fVar266 * (float)local_428._0_4_;
        fVar136 = -fVar156 * fVar276 * (float)local_428._4_4_;
        fVar144 = -fVar183 * fVar277 * (float)uStack_420;
        fVar156 = -fVar185 * fVar293 * register0x0000150c;
        local_2b8 = local_1b8 + fVar101;
        fStack_2b4 = fStack_1b4 + fVar136;
        fStack_2b0 = fStack_1b0 + fVar144;
        fStack_2ac = fStack_1ac + fVar156;
        fVar303 = fVar266 * 0.0 * (float)local_428._0_4_;
        fVar305 = fVar276 * 0.0 * (float)local_428._4_4_;
        fVar108 = fVar277 * 0.0 * (float)uStack_420;
        fVar138 = fVar293 * 0.0 * register0x0000150c;
        local_368 = fVar107 + fVar303;
        fStack_364 = fVar137 + fVar305;
        fStack_360 = fVar140 + fVar108;
        fStack_35c = fVar142 + fVar138;
        fVar283 = fVar232 * fVar154 * auVar225._0_4_;
        fVar290 = fVar239 * fVar172 * auVar225._4_4_;
        fVar292 = fVar228 * fVar173 * auVar225._8_4_;
        fVar294 = fVar265 * fVar174 * auVar225._12_4_;
        fVar277 = local_298 + fVar283;
        fVar293 = fStack_294 + fVar290;
        fVar184 = fStack_290 + fVar292;
        fVar186 = fStack_28c + fVar294;
        fVar183 = -fVar248 * fVar154 * auVar225._0_4_;
        fVar185 = -fVar252 * fVar172 * auVar225._4_4_;
        fVar213 = -fVar255 * fVar173 * auVar225._8_4_;
        fVar227 = -fVar187 * fVar174 * auVar225._12_4_;
        fVar228 = fVar279 + fVar183;
        fVar265 = fVar282 + fVar185;
        fVar266 = fVar289 + fVar213;
        fVar276 = fVar291 + fVar227;
        fVar106 = fVar154 * 0.0 * auVar225._0_4_;
        fVar139 = fVar172 * 0.0 * auVar225._4_4_;
        fVar154 = fVar173 * 0.0 * auVar225._8_4_;
        fVar172 = fVar174 * 0.0 * auVar225._12_4_;
        fVar212 = local_1c8 - fVar238;
        fVar217 = fStack_1c4 - fVar281;
        fVar232 = fStack_1c0 - fVar278;
        fVar239 = fStack_1bc - fVar280;
        fVar187 = fVar68 + fVar106;
        fVar248 = fVar102 + fVar139;
        fVar252 = fVar104 + fVar154;
        fVar255 = fVar105 + fVar172;
        fVar101 = local_1b8 - fVar101;
        fVar136 = fStack_1b4 - fVar136;
        fVar144 = fStack_1b0 - fVar144;
        fVar156 = fStack_1ac - fVar156;
        fVar107 = fVar107 - fVar303;
        fVar137 = fVar137 - fVar305;
        fVar140 = fVar140 - fVar108;
        fVar142 = fVar142 - fVar138;
        uVar61 = -(uint)(0.0 < (fVar101 * (fVar187 - fVar107) - fVar107 * (fVar228 - fVar101)) * 0.0
                               + (fVar107 * (fVar277 - fVar212) - (fVar187 - fVar107) * fVar212) *
                                 0.0 + ((fVar228 - fVar101) * fVar212 -
                                       (fVar277 - fVar212) * fVar101));
        uVar62 = -(uint)(0.0 < (fVar136 * (fVar248 - fVar137) - fVar137 * (fVar265 - fVar136)) * 0.0
                               + (fVar137 * (fVar293 - fVar217) - (fVar248 - fVar137) * fVar217) *
                                 0.0 + ((fVar265 - fVar136) * fVar217 -
                                       (fVar293 - fVar217) * fVar136));
        uVar63 = -(uint)(0.0 < (fVar144 * (fVar252 - fVar140) - fVar140 * (fVar266 - fVar144)) * 0.0
                               + (fVar140 * (fVar184 - fVar232) - (fVar252 - fVar140) * fVar232) *
                                 0.0 + ((fVar266 - fVar144) * fVar232 -
                                       (fVar184 - fVar232) * fVar144));
        uVar64 = -(uint)(0.0 < (fVar156 * (fVar255 - fVar142) - fVar142 * (fVar276 - fVar156)) * 0.0
                               + (fVar142 * (fVar186 - fVar239) - (fVar255 - fVar142) * fVar239) *
                                 0.0 + ((fVar276 - fVar156) * fVar239 -
                                       (fVar186 - fVar239) * fVar156));
        fVar108 = (float)((uint)(local_298 - fVar283) & uVar61 |
                         ~uVar61 & (uint)(local_1c8 + fVar238));
        fVar138 = (float)((uint)(fStack_294 - fVar290) & uVar62 |
                         ~uVar62 & (uint)(fStack_1c4 + fVar281));
        fVar141 = (float)((uint)(fStack_290 - fVar292) & uVar63 |
                         ~uVar63 & (uint)(fStack_1c0 + fVar278));
        fVar143 = (float)((uint)(fStack_28c - fVar294) & uVar64 |
                         ~uVar64 & (uint)(fStack_1bc + fVar280));
        fVar278 = (float)((uint)(fVar279 - fVar183) & uVar61 | ~uVar61 & (uint)local_2b8);
        fVar280 = (float)((uint)(fVar282 - fVar185) & uVar62 | ~uVar62 & (uint)fStack_2b4);
        fVar283 = (float)((uint)(fVar289 - fVar213) & uVar63 | ~uVar63 & (uint)fStack_2b0);
        fVar290 = (float)((uint)(fVar291 - fVar227) & uVar64 | ~uVar64 & (uint)fStack_2ac);
        fVar173 = (float)((uint)(fVar68 - fVar106) & uVar61 | ~uVar61 & (uint)local_368);
        fVar174 = (float)((uint)(fVar102 - fVar139) & uVar62 | ~uVar62 & (uint)fStack_364);
        fVar183 = (float)((uint)(fVar104 - fVar154) & uVar63 | ~uVar63 & (uint)fStack_360);
        fVar185 = (float)((uint)(fVar105 - fVar172) & uVar64 | ~uVar64 & (uint)fStack_35c);
        fVar213 = (float)((uint)fVar212 & uVar61 | ~uVar61 & (uint)fVar277);
        fVar227 = (float)((uint)fVar217 & uVar62 | ~uVar62 & (uint)fVar293);
        fVar238 = (float)((uint)fVar232 & uVar63 | ~uVar63 & (uint)fVar184);
        fVar281 = (float)((uint)fVar239 & uVar64 | ~uVar64 & (uint)fVar186);
        fVar106 = (float)((uint)fVar101 & uVar61 | ~uVar61 & (uint)fVar228);
        fVar139 = (float)((uint)fVar136 & uVar62 | ~uVar62 & (uint)fVar265);
        fVar154 = (float)((uint)fVar144 & uVar63 | ~uVar63 & (uint)fVar266);
        fVar172 = (float)((uint)fVar156 & uVar64 | ~uVar64 & (uint)fVar276);
        fVar292 = (float)((uint)fVar107 & uVar61 | ~uVar61 & (uint)fVar187);
        fVar294 = (float)((uint)fVar137 & uVar62 | ~uVar62 & (uint)fVar248);
        fVar303 = (float)((uint)fVar140 & uVar63 | ~uVar63 & (uint)fVar252);
        fVar305 = (float)((uint)fVar142 & uVar64 | ~uVar64 & (uint)fVar255);
        fVar277 = (float)((uint)fVar277 & uVar61 | ~uVar61 & (uint)fVar212) - fVar108;
        fVar279 = (float)((uint)fVar293 & uVar62 | ~uVar62 & (uint)fVar217) - fVar138;
        fVar282 = (float)((uint)fVar184 & uVar63 | ~uVar63 & (uint)fVar232) - fVar141;
        fVar289 = (float)((uint)fVar186 & uVar64 | ~uVar64 & (uint)fVar239) - fVar143;
        fVar212 = (float)((uint)fVar228 & uVar61 | ~uVar61 & (uint)fVar101) - fVar278;
        fVar217 = (float)((uint)fVar265 & uVar62 | ~uVar62 & (uint)fVar136) - fVar280;
        fVar232 = (float)((uint)fVar266 & uVar63 | ~uVar63 & (uint)fVar144) - fVar283;
        fVar239 = (float)((uint)fVar276 & uVar64 | ~uVar64 & (uint)fVar156) - fVar290;
        fVar291 = (float)((uint)fVar187 & uVar61 | ~uVar61 & (uint)fVar107) - fVar173;
        fVar293 = (float)((uint)fVar248 & uVar62 | ~uVar62 & (uint)fVar137) - fVar174;
        fVar184 = (float)((uint)fVar252 & uVar63 | ~uVar63 & (uint)fVar140) - fVar183;
        fVar186 = (float)((uint)fVar255 & uVar64 | ~uVar64 & (uint)fVar142) - fVar185;
        fVar68 = fVar108 - fVar213;
        fVar102 = fVar138 - fVar227;
        fVar104 = fVar141 - fVar238;
        fVar105 = fVar143 - fVar281;
        fVar228 = fVar278 - fVar106;
        fVar265 = fVar280 - fVar139;
        fVar266 = fVar283 - fVar154;
        fVar276 = fVar290 - fVar172;
        local_408 = CONCAT44(fVar280,fVar278);
        uStack_400 = CONCAT44(fVar290,fVar283);
        fVar101 = fVar173 - fVar292;
        fVar136 = fVar174 - fVar294;
        fVar144 = fVar183 - fVar303;
        fVar156 = fVar185 - fVar305;
        fVar187 = (fVar278 * fVar291 - fVar173 * fVar212) * 0.0 +
                  (fVar173 * fVar277 - fVar108 * fVar291) * 0.0 +
                  (fVar108 * fVar212 - fVar278 * fVar277);
        fVar248 = (fVar280 * fVar293 - fVar174 * fVar217) * 0.0 +
                  (fVar174 * fVar279 - fVar138 * fVar293) * 0.0 +
                  (fVar138 * fVar217 - fVar280 * fVar279);
        auVar162._4_4_ = fVar248;
        auVar162._0_4_ = fVar187;
        fVar252 = (fVar283 * fVar184 - fVar183 * fVar232) * 0.0 +
                  (fVar183 * fVar282 - fVar141 * fVar184) * 0.0 +
                  (fVar141 * fVar232 - fVar283 * fVar282);
        fVar255 = (fVar290 * fVar186 - fVar185 * fVar239) * 0.0 +
                  (fVar185 * fVar289 - fVar143 * fVar186) * 0.0 +
                  (fVar143 * fVar239 - fVar290 * fVar289);
        auVar297._0_4_ =
             (fVar106 * fVar101 - fVar292 * fVar228) * 0.0 +
             (fVar292 * fVar68 - fVar213 * fVar101) * 0.0 + (fVar213 * fVar228 - fVar106 * fVar68);
        auVar297._4_4_ =
             (fVar139 * fVar136 - fVar294 * fVar265) * 0.0 +
             (fVar294 * fVar102 - fVar227 * fVar136) * 0.0 + (fVar227 * fVar265 - fVar139 * fVar102)
        ;
        auVar297._8_4_ =
             (fVar154 * fVar144 - fVar303 * fVar266) * 0.0 +
             (fVar303 * fVar104 - fVar238 * fVar144) * 0.0 + (fVar238 * fVar266 - fVar154 * fVar104)
        ;
        auVar297._12_4_ =
             (fVar172 * fVar156 - fVar305 * fVar276) * 0.0 +
             (fVar305 * fVar105 - fVar281 * fVar156) * 0.0 + (fVar281 * fVar276 - fVar172 * fVar105)
        ;
        auVar162._8_4_ = fVar252;
        auVar162._12_4_ = fVar255;
        auVar70 = maxps(auVar162,auVar297);
        bVar46 = auVar70._0_4_ <= 0.0 && bVar46;
        auVar163._0_4_ = -(uint)bVar46;
        bVar47 = auVar70._4_4_ <= 0.0 && bVar47;
        auVar163._4_4_ = -(uint)bVar47;
        bVar45 = auVar70._8_4_ <= 0.0 && bVar45;
        auVar163._8_4_ = -(uint)bVar45;
        bVar44 = auVar70._12_4_ <= 0.0 && bVar44;
        auVar163._12_4_ = -(uint)bVar44;
        iVar48 = movmskps(iVar48,auVar163);
        if (iVar48 == 0) {
LAB_00be5c58:
          auVar164._8_8_ = uStack_2e0;
          auVar164._0_8_ = local_2e8;
        }
        else {
          fVar106 = (ray->super_RayK<1>).tfar;
          auVar178._0_4_ = fVar101 * fVar212;
          auVar178._4_4_ = fVar136 * fVar217;
          auVar178._8_4_ = fVar144 * fVar232;
          auVar178._12_4_ = fVar156 * fVar239;
          fVar213 = fVar228 * fVar291 - auVar178._0_4_;
          fVar227 = fVar265 * fVar293 - auVar178._4_4_;
          fVar238 = fVar266 * fVar184 - auVar178._8_4_;
          fVar281 = fVar276 * fVar186 - auVar178._12_4_;
          fVar101 = fVar101 * fVar277 - fVar291 * fVar68;
          fVar139 = fVar136 * fVar279 - fVar293 * fVar102;
          fVar154 = fVar144 * fVar282 - fVar184 * fVar104;
          fVar172 = fVar156 * fVar289 - fVar186 * fVar105;
          fVar228 = fVar68 * fVar212 - fVar228 * fVar277;
          fVar217 = fVar102 * fVar217 - fVar265 * fVar279;
          fVar232 = fVar104 * fVar232 - fVar266 * fVar282;
          fVar239 = fVar105 * fVar239 - fVar276 * fVar289;
          auVar207._0_4_ = fVar213 * 0.0 + fVar101 * 0.0 + fVar228;
          auVar207._4_4_ = fVar227 * 0.0 + fVar139 * 0.0 + fVar217;
          auVar207._8_4_ = fVar238 * 0.0 + fVar154 * 0.0 + fVar232;
          auVar207._12_4_ = fVar281 * 0.0 + fVar172 * 0.0 + fVar239;
          auVar70 = rcpps(auVar178,auVar207);
          fVar136 = auVar70._0_4_;
          fVar144 = auVar70._4_4_;
          fVar156 = auVar70._8_4_;
          fVar212 = auVar70._12_4_;
          fVar136 = (1.0 - auVar207._0_4_ * fVar136) * fVar136 + fVar136;
          fVar144 = (1.0 - auVar207._4_4_ * fVar144) * fVar144 + fVar144;
          fVar156 = (1.0 - auVar207._8_4_ * fVar156) * fVar156 + fVar156;
          fVar212 = (1.0 - auVar207._12_4_ * fVar212) * fVar212 + fVar212;
          fVar101 = (fVar173 * fVar228 + fVar278 * fVar101 + fVar108 * fVar213) * fVar136;
          fVar139 = (fVar174 * fVar217 + fVar280 * fVar139 + fVar138 * fVar227) * fVar144;
          fVar154 = (fVar183 * fVar232 + fVar283 * fVar154 + fVar141 * fVar238) * fVar156;
          fVar172 = (fVar185 * fVar239 + fVar290 * fVar172 + fVar143 * fVar281) * fVar212;
          bVar46 = (fVar101 <= fVar106 && fVar155 <= fVar101) && bVar46;
          auVar92._0_4_ = -(uint)bVar46;
          bVar47 = (fVar139 <= fVar106 && fVar155 <= fVar139) && bVar47;
          auVar92._4_4_ = -(uint)bVar47;
          bVar45 = (fVar154 <= fVar106 && fVar155 <= fVar154) && bVar45;
          auVar92._8_4_ = -(uint)bVar45;
          bVar44 = (fVar172 <= fVar106 && fVar155 <= fVar172) && bVar44;
          auVar92._12_4_ = -(uint)bVar44;
          iVar48 = movmskps(iVar48,auVar92);
          if (iVar48 == 0) goto LAB_00be5c58;
          auVar93._0_8_ =
               CONCAT44(-(uint)(auVar207._4_4_ != 0.0 && bVar47),
                        -(uint)(auVar207._0_4_ != 0.0 && bVar46));
          auVar93._8_4_ = -(uint)(auVar207._8_4_ != 0.0 && bVar45);
          auVar93._12_4_ = -(uint)(auVar207._12_4_ != 0.0 && bVar44);
          iVar48 = movmskps(iVar48,auVar93);
          auVar164._8_8_ = uStack_2e0;
          auVar164._0_8_ = local_2e8;
          if (iVar48 != 0) {
            fVar187 = fVar187 * fVar136;
            fVar248 = fVar248 * fVar144;
            fVar252 = fVar252 * fVar156;
            fVar255 = fVar255 * fVar212;
            local_348 = (float)((uint)(1.0 - fVar187) & uVar61 | ~uVar61 & (uint)fVar187);
            fStack_344 = (float)((uint)(1.0 - fVar248) & uVar62 | ~uVar62 & (uint)fVar248);
            fStack_340 = (float)((uint)(1.0 - fVar252) & uVar63 | ~uVar63 & (uint)fVar252);
            fStack_33c = (float)((uint)(1.0 - fVar255) & uVar64 | ~uVar64 & (uint)fVar255);
            auVar164._8_4_ = auVar93._8_4_;
            auVar164._0_8_ = auVar93._0_8_;
            auVar164._12_4_ = auVar93._12_4_;
            local_1d8 = (float)(~uVar61 & (uint)(auVar297._0_4_ * fVar136) |
                               (uint)(1.0 - auVar297._0_4_ * fVar136) & uVar61);
            fStack_1d4 = (float)(~uVar62 & (uint)(auVar297._4_4_ * fVar144) |
                                (uint)(1.0 - auVar297._4_4_ * fVar144) & uVar62);
            fStack_1d0 = (float)(~uVar63 & (uint)(auVar297._8_4_ * fVar156) |
                                (uint)(1.0 - auVar297._8_4_ * fVar156) & uVar63);
            fStack_1cc = (float)(~uVar64 & (uint)(auVar297._12_4_ * fVar212) |
                                (uint)(1.0 - auVar297._12_4_ * fVar212) & uVar64);
            local_358 = fVar101;
            fStack_354 = fVar139;
            fStack_350 = fVar154;
            fStack_34c = fVar172;
          }
        }
        iVar48 = movmskps(iVar48,auVar164);
        if (iVar48 != 0) {
          fVar101 = (auVar225._0_4_ - (float)local_428._0_4_) * local_348 + (float)local_428._0_4_;
          fVar106 = (auVar225._4_4_ - (float)local_428._4_4_) * fStack_344 + (float)local_428._4_4_;
          fVar136 = (auVar225._8_4_ - (float)uStack_420) * fStack_340 + (float)uStack_420;
          fVar139 = (auVar225._12_4_ - register0x0000150c) * fStack_33c + register0x0000150c;
          fVar155 = local_320->depth_scale;
          auVar94._0_4_ = -(uint)(fVar155 * (fVar101 + fVar101) < local_358) & auVar164._0_4_;
          auVar94._4_4_ = -(uint)(fVar155 * (fVar106 + fVar106) < fStack_354) & auVar164._4_4_;
          auVar94._8_4_ = -(uint)(fVar155 * (fVar136 + fVar136) < fStack_350) & auVar164._8_4_;
          auVar94._12_4_ = -(uint)(fVar155 * (fVar139 + fVar139) < fStack_34c) & auVar164._12_4_;
          iVar48 = movmskps((int)local_320,auVar94);
          fVar155 = local_348;
          fVar101 = fStack_344;
          fVar106 = fStack_340;
          fVar136 = fStack_33c;
          fVar139 = local_358;
          fVar144 = fStack_354;
          fVar154 = fStack_350;
          fVar156 = fStack_34c;
          if (iVar48 != 0) {
            local_1d8 = local_1d8 + local_1d8 + -1.0;
            fStack_1d4 = fStack_1d4 + fStack_1d4 + -1.0;
            fStack_1d0 = fStack_1d0 + fStack_1d0 + -1.0;
            fStack_1cc = fStack_1cc + fStack_1cc + -1.0;
            local_158 = local_348;
            fStack_154 = fStack_344;
            fStack_150 = fStack_340;
            fStack_14c = fStack_33c;
            local_148 = local_1d8;
            fStack_144 = fStack_1d4;
            fStack_140 = fStack_1d0;
            fStack_13c = fStack_1cc;
            local_138 = local_358;
            fStack_134 = fStack_354;
            fStack_130 = fStack_350;
            fStack_12c = fStack_34c;
            local_128 = 0;
            local_124 = iVar18;
            local_118 = CONCAT44(fStack_2d4,local_2d8);
            uStack_110 = CONCAT44(fStack_2cc,fStack_2d0);
            local_108 = CONCAT44(fVar219,fVar218);
            uStack_100 = CONCAT44(fStack_21c,fVar226);
            local_f8 = CONCAT44(fStack_234,local_238);
            uStack_f0 = CONCAT44(fStack_22c,fStack_230);
            local_e8 = CONCAT44(fStack_214,local_218);
            uStack_e0 = CONCAT44(fStack_20c,fStack_210);
            local_d8 = auVar94;
            uVar61 = (ray->super_RayK<1>).mask;
            if ((pGVar56->mask & uVar61) != 0) {
              local_338 = auVar94;
              fVar67 = 1.0 / fVar67;
              local_c8[0] = fVar67 * (local_348 + 0.0);
              local_c8[1] = fVar67 * (fStack_344 + 1.0);
              local_c8[2] = fVar67 * (fStack_340 + 2.0);
              local_c8[3] = fVar67 * (fStack_33c + 3.0);
              local_b8 = CONCAT44(fStack_1d4,local_1d8);
              uStack_b0 = CONCAT44(fStack_1cc,fStack_1d0);
              local_a8[0] = local_358;
              local_a8[1] = fStack_354;
              local_a8[2] = fStack_350;
              local_a8[3] = fStack_34c;
              auVar123._0_4_ = auVar94._0_4_ & (uint)local_358;
              auVar123._4_4_ = auVar94._4_4_ & (uint)fStack_354;
              auVar123._8_4_ = auVar94._8_4_ & (uint)fStack_350;
              auVar123._12_4_ = auVar94._12_4_ & (uint)fStack_34c;
              auVar147._0_8_ = CONCAT44(~auVar94._4_4_,~auVar94._0_4_) & 0x7f8000007f800000;
              auVar147._8_4_ = ~auVar94._8_4_ & 0x7f800000;
              auVar147._12_4_ = ~auVar94._12_4_ & 0x7f800000;
              auVar147 = auVar147 | auVar123;
              auVar165._4_4_ = auVar147._0_4_;
              auVar165._0_4_ = auVar147._4_4_;
              auVar165._8_4_ = auVar147._12_4_;
              auVar165._12_4_ = auVar147._8_4_;
              auVar70 = minps(auVar165,auVar147);
              auVar124._0_8_ = auVar70._8_8_;
              auVar124._8_4_ = auVar70._0_4_;
              auVar124._12_4_ = auVar70._4_4_;
              auVar70 = minps(auVar124,auVar70);
              auVar125._0_8_ =
                   CONCAT44(-(uint)(auVar70._4_4_ == auVar147._4_4_) & auVar94._4_4_,
                            -(uint)(auVar70._0_4_ == auVar147._0_4_) & auVar94._0_4_);
              auVar125._8_4_ = -(uint)(auVar70._8_4_ == auVar147._8_4_) & auVar94._8_4_;
              auVar125._12_4_ = -(uint)(auVar70._12_4_ == auVar147._12_4_) & auVar94._12_4_;
              iVar48 = movmskps(uVar61,auVar125);
              if (iVar48 != 0) {
                auVar94._8_4_ = auVar125._8_4_;
                auVar94._0_8_ = auVar125._0_8_;
                auVar94._12_4_ = auVar125._12_4_;
              }
              uVar61 = movmskps(iVar48,auVar94);
              lVar59 = 0;
              if (uVar61 != 0) {
                for (; (uVar61 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar56->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar67 = local_c8[lVar59];
                fVar172 = *(float *)((long)&local_b8 + lVar59 * 4);
                fVar183 = 1.0 - fVar67;
                fVar185 = fVar67 * fVar183 * 4.0;
                fVar173 = -fVar183 * fVar183 * 0.5;
                fVar174 = (-fVar67 * fVar67 - fVar185) * 0.5;
                fVar183 = (fVar183 * fVar183 + fVar185) * 0.5;
                fVar185 = fVar67 * fVar67 * 0.5;
                (ray->super_RayK<1>).tfar = local_a8[lVar59];
                *(ulong *)&(ray->Ng).field_0 =
                     CONCAT44(fVar173 * fStack_2d4 +
                              fVar174 * fVar219 + fVar183 * fStack_234 + fVar185 * fStack_214,
                              fVar173 * local_2d8 +
                              fVar174 * fVar218 + fVar183 * local_238 + fVar185 * local_218);
                (ray->Ng).field_0.field_0.z =
                     fVar173 * fStack_2d0 +
                     fVar174 * fVar226 + fVar183 * fStack_230 + fVar185 * fStack_210;
                ray->u = fVar67;
                ray->v = fVar172;
                ray->primID = (uint)local_390;
                ray->geomID = (uint)local_3c0;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                pRVar53 = (RTCIntersectArguments *)context;
              }
              else {
                local_408 = CONCAT44(fStack_234,local_238);
                uStack_400 = CONCAT44(fStack_22c,fStack_230);
                uStack_420 = CONCAT44(fStack_20c,fStack_210);
                local_428 = (undefined1  [8])CONCAT44(fStack_214,local_218);
                do {
                  local_26c = local_c8[lVar59];
                  local_268 = *(undefined4 *)((long)&local_b8 + lVar59 * 4);
                  fVar67 = (ray->super_RayK<1>).tfar;
                  (ray->super_RayK<1>).tfar = local_a8[lVar59];
                  local_318.context = context->user;
                  fVar174 = 1.0 - local_26c;
                  fVar183 = local_26c * fVar174 * 4.0;
                  fVar172 = -fVar174 * fVar174 * 0.5;
                  fVar173 = (-local_26c * local_26c - fVar183) * 0.5;
                  fVar174 = (fVar174 * fVar174 + fVar183) * 0.5;
                  fVar183 = local_26c * local_26c * 0.5;
                  local_278 = CONCAT44(fVar172 * fStack_2d4 +
                                       fVar173 * fVar219 +
                                       fVar174 * local_408._4_4_ + fVar183 * (float)local_428._4_4_,
                                       fVar172 * local_2d8 +
                                       fVar173 * fVar218 +
                                       fVar174 * (float)local_408 + fVar183 * (float)local_428._0_4_
                                      );
                  local_270 = fVar172 * fStack_2d0 +
                              fVar173 * fVar226 +
                              fVar174 * (float)uStack_400 + fVar183 * (float)uStack_420;
                  local_264 = (int)local_390;
                  local_260 = (int)local_3c0;
                  local_25c = (local_318.context)->instID[0];
                  local_258 = (local_318.context)->instPrimID[0];
                  local_44c.m128[0] = -NAN;
                  local_318.valid = (int *)&local_44c;
                  pRVar53 = (RTCIntersectArguments *)pGVar56->userPtr;
                  local_318.geometryUserPtr = pRVar53;
                  local_318.ray = (RTCRayN *)ray;
                  local_318.hit = (RTCHitN *)&local_278;
                  local_318.N = 1;
                  if ((pGVar56->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar56->intersectionFilterN)(&local_318), uVar54 = extraout_RDX_01,
                     fVar155 = local_348, fVar101 = fStack_344, fVar106 = fStack_340,
                     fVar136 = fStack_33c, fVar139 = local_358, fVar144 = fStack_354,
                     fVar154 = fStack_350, fVar156 = fStack_34c, fVar188 = local_3b8,
                     fVar231 = fStack_3b4, fVar240 = fStack_3b0, fVar246 = fStack_3ac,
                     uVar295 = local_44c.m128[1], uVar249 = local_44c.m128[2],
                     uVar253 = local_44c.m128[3], fVar250 = fStack_43c, fVar103 = local_3f8,
                     fVar256 = fStack_3f4, fVar263 = fStack_3f0, fVar264 = fStack_3ec,
                     *(float *)local_318.valid != 0.0)) {
                    pRVar53 = context->args;
                    if ((RTCIntersectArguments *)pRVar53->filter != (RTCIntersectArguments *)0x0) {
                      if ((((ulong)*(Scene **)&pRVar53->flags & 2) != 0) ||
                         (((pGVar56->field_8).field_0x2 & 0x40) != 0)) {
                        (*(code *)pRVar53->filter)(&local_318);
                        uVar54 = extraout_RDX_02;
                        fVar155 = local_348;
                        fVar101 = fStack_344;
                        fVar106 = fStack_340;
                        fVar136 = fStack_33c;
                        fVar139 = local_358;
                        fVar144 = fStack_354;
                        fVar154 = fStack_350;
                        fVar156 = fStack_34c;
                        fVar188 = local_3b8;
                        fVar231 = fStack_3b4;
                        fVar240 = fStack_3b0;
                        fVar246 = fStack_3ac;
                        uVar295 = local_44c.m128[1];
                        uVar249 = local_44c.m128[2];
                        uVar253 = local_44c.m128[3];
                        fVar250 = fStack_43c;
                        fVar103 = local_3f8;
                        fVar256 = fStack_3f4;
                        fVar263 = fStack_3f0;
                        fVar264 = fStack_3ec;
                      }
                      if (*(float *)local_318.valid == 0.0) goto LAB_00be6f98;
                    }
                    *(float *)((long)local_318.ray + 0x30) = *(float *)local_318.hit;
                    *(float *)((long)local_318.ray + 0x34) = *(float *)(local_318.hit + 4);
                    *(float *)((long)local_318.ray + 0x38) = *(float *)(local_318.hit + 8);
                    *(float *)((long)local_318.ray + 0x3c) = *(float *)(local_318.hit + 0xc);
                    *(float *)((long)local_318.ray + 0x40) = *(float *)(local_318.hit + 0x10);
                    *(float *)((long)local_318.ray + 0x44) = *(float *)(local_318.hit + 0x14);
                    *(float *)((long)local_318.ray + 0x48) = *(float *)(local_318.hit + 0x18);
                    uVar54 = (ulong)(uint)*(float *)(local_318.hit + 0x1c);
                    *(float *)((long)local_318.ray + 0x4c) = *(float *)(local_318.hit + 0x1c);
                    pRVar53 = (RTCIntersectArguments *)(ulong)(uint)*(float *)(local_318.hit + 0x20)
                    ;
                    *(float *)((long)local_318.ray + 0x50) = *(float *)(local_318.hit + 0x20);
                    paVar50 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_318.ray;
                  }
                  else {
LAB_00be6f98:
                    (ray->super_RayK<1>).tfar = fVar67;
                    paVar50 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_318.valid;
                  }
                  *(undefined4 *)(local_338 + lVar59 * 4) = 0;
                  fVar67 = (ray->super_RayK<1>).tfar;
                  auVar98._0_4_ = -(uint)(fVar139 <= fVar67) & local_338._0_4_;
                  auVar98._4_4_ = -(uint)(fVar144 <= fVar67) & local_338._4_4_;
                  auVar98._8_4_ = -(uint)(fVar154 <= fVar67) & local_338._8_4_;
                  auVar98._12_4_ = -(uint)(fVar156 <= fVar67) & local_338._12_4_;
                  local_338 = auVar98;
                  iVar48 = movmskps((int)paVar50,auVar98);
                  if (iVar48 != 0) {
                    auVar133._0_4_ = auVar98._0_4_ & (uint)fVar139;
                    auVar133._4_4_ = auVar98._4_4_ & (uint)fVar144;
                    auVar133._8_4_ = auVar98._8_4_ & (uint)fVar154;
                    auVar133._12_4_ = auVar98._12_4_ & (uint)fVar156;
                    auVar153._0_8_ = CONCAT44(~auVar98._4_4_,~auVar98._0_4_) & 0x7f8000007f800000;
                    auVar153._8_4_ = ~auVar98._8_4_ & 0x7f800000;
                    auVar153._12_4_ = ~auVar98._12_4_ & 0x7f800000;
                    auVar153 = auVar153 | auVar133;
                    auVar171._4_4_ = auVar153._0_4_;
                    auVar171._0_4_ = auVar153._4_4_;
                    auVar171._8_4_ = auVar153._12_4_;
                    auVar171._12_4_ = auVar153._8_4_;
                    auVar70 = minps(auVar171,auVar153);
                    auVar134._0_8_ = auVar70._8_8_;
                    auVar134._8_4_ = auVar70._0_4_;
                    auVar134._12_4_ = auVar70._4_4_;
                    auVar70 = minps(auVar134,auVar70);
                    auVar135._0_8_ =
                         CONCAT44(-(uint)(auVar70._4_4_ == auVar153._4_4_) & auVar98._4_4_,
                                  -(uint)(auVar70._0_4_ == auVar153._0_4_) & auVar98._0_4_);
                    auVar135._8_4_ = -(uint)(auVar70._8_4_ == auVar153._8_4_) & auVar98._8_4_;
                    auVar135._12_4_ = -(uint)(auVar70._12_4_ == auVar153._12_4_) & auVar98._12_4_;
                    iVar51 = movmskps((int)pRVar53,auVar135);
                    if (iVar51 != 0) {
                      auVar98._8_4_ = auVar135._8_4_;
                      auVar98._0_8_ = auVar135._0_8_;
                      auVar98._12_4_ = auVar135._12_4_;
                    }
                    uVar52 = movmskps(iVar51,auVar98);
                    pRVar53 = (RTCIntersectArguments *)
                              CONCAT44((int)((ulong)pRVar53 >> 0x20),uVar52);
                    lVar59 = 0;
                    if (pRVar53 != (RTCIntersectArguments *)0x0) {
                      for (; ((ulong)pRVar53 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                      }
                    }
                  }
                } while ((char)iVar48 != '\0');
              }
            }
          }
          uVar52 = SUB84(pRVar53,0);
          local_348 = fVar155;
          fStack_344 = fVar101;
          fStack_340 = fVar106;
          fStack_33c = fVar136;
          fVar230 = local_3e8;
          local_358 = fVar139;
          fStack_354 = fVar144;
          fStack_350 = fVar154;
          fStack_34c = fVar156;
        }
      }
      if (4 < iVar18) {
        local_3f8 = fVar103;
        fStack_3f4 = fVar256;
        fStack_3f0 = fVar263;
        fStack_3ec = fVar264;
        local_3b8 = fVar188;
        fStack_3b4 = fVar231;
        fStack_3b0 = fVar240;
        fStack_3ac = fVar246;
        local_68 = iVar18;
        iStack_64 = iVar18;
        iStack_60 = iVar18;
        iStack_5c = iVar18;
        local_208._4_4_ = local_208._0_4_;
        fStack_200 = (float)local_208._0_4_;
        fStack_1fc = (float)local_208._0_4_;
        local_78 = 1.0 / (float)local_248._0_4_;
        fStack_74 = local_78;
        fStack_70 = local_78;
        fStack_6c = local_78;
        lVar59 = 4;
        fStack_3e4 = fVar230;
        local_3e8 = fVar230;
        fStack_3e0 = fVar230;
        fStack_3dc = fVar230;
        fVar155 = local_3a8;
        fVar67 = fStack_3a4;
        fVar101 = fStack_3a0;
        fVar103 = fStack_39c;
        do {
          fVar232 = fStack_220;
          fVar227 = fStack_224;
          fVar226 = local_228;
          uVar62 = (uint)lVar59;
          pRVar53 = (RTCIntersectArguments *)(bspline_basis0 + lVar20);
          pauVar8 = (undefined1 (*) [16])((long)&pRVar53->flags + lVar59 * 4);
          fVar106 = *(float *)*pauVar8;
          fVar136 = *(float *)(*pauVar8 + 4);
          fVar139 = *(float *)(*pauVar8 + 8);
          auVar23 = *(undefined1 (*) [12])*pauVar8;
          fVar144 = *(float *)(*pauVar8 + 0xc);
          pfVar1 = (float *)(lVar20 + 0x222bfac + lVar59 * 4);
          local_368 = *pfVar1;
          fStack_364 = pfVar1[1];
          fStack_360 = pfVar1[2];
          fStack_35c = pfVar1[3];
          pfVar1 = (float *)(lVar20 + 0x222c430 + lVar59 * 4);
          local_2b8 = *pfVar1;
          fStack_2b4 = pfVar1[1];
          fStack_2b0 = pfVar1[2];
          fStack_2ac = pfVar1[3];
          pfVar1 = (float *)(lVar20 + 0x222c8b4 + lVar59 * 4);
          local_298 = *pfVar1;
          fStack_294 = pfVar1[1];
          fStack_290 = pfVar1[2];
          fStack_28c = pfVar1[3];
          local_1b8 = local_288 * fVar106 +
                      local_198 * local_368 + fVar155 * local_2b8 + (float)uVar295 * local_298;
          fStack_1b4 = fStack_284 * fVar136 +
                       fStack_194 * fStack_364 + fVar67 * fStack_2b4 + (float)uVar249 * fStack_294;
          fStack_1b0 = fStack_280 * fVar139 +
                       fStack_190 * fStack_360 + fVar101 * fStack_2b0 + (float)uVar253 * fStack_290;
          fStack_1ac = fStack_27c * fVar144 +
                       fStack_18c * fStack_35c + fVar103 * fStack_2ac + fVar250 * fStack_28c;
          local_1c8 = local_178 * fVar106 +
                      local_1a8 * local_368 + fVar211 * local_2b8 + local_418 * local_298;
          fStack_1c4 = fStack_174 * fVar136 +
                       fStack_1a4 * fStack_364 + fVar211 * fStack_2b4 + fStack_414 * fStack_294;
          fStack_1c0 = fStack_170 * fVar139 +
                       fStack_1a0 * fStack_360 + fVar211 * fStack_2b0 + fStack_410 * fStack_290;
          fStack_1bc = fStack_16c * fVar144 +
                       fStack_19c * fStack_35c + fVar211 * fStack_2ac + fStack_40c * fStack_28c;
          _local_2a8 = *pauVar8;
          local_428._0_4_ =
               local_98 * fVar106 +
               local_88 * local_368 + local_188 * local_2b8 + local_58 * local_298;
          local_428._4_4_ =
               fStack_94 * fVar136 +
               fStack_84 * fStack_364 + fStack_184 * fStack_2b4 + fStack_54 * fStack_294;
          uStack_420._0_4_ =
               fStack_90 * fVar139 +
               fStack_80 * fStack_360 + fStack_180 * fStack_2b0 + fStack_50 * fStack_290;
          register0x0000124c =
               fStack_8c * fVar144 +
               fStack_7c * fStack_35c + fStack_17c * fStack_2ac + fStack_4c * fStack_28c;
          pfVar1 = (float *)(bspline_basis1 + lVar20 + lVar59 * 4);
          fVar106 = *pfVar1;
          fVar136 = pfVar1[1];
          fVar139 = pfVar1[2];
          fVar154 = pfVar1[3];
          pfVar1 = (float *)(lVar20 + 0x222e3cc + lVar59 * 4);
          fVar156 = *pfVar1;
          fVar172 = pfVar1[1];
          fVar173 = pfVar1[2];
          fVar174 = pfVar1[3];
          pfVar1 = (float *)(lVar20 + 0x222e850 + lVar59 * 4);
          fVar183 = *pfVar1;
          fVar185 = pfVar1[1];
          fVar188 = pfVar1[2];
          fVar212 = pfVar1[3];
          pfVar1 = (float *)(lVar20 + 0x222ecd4 + lVar59 * 4);
          fVar213 = *pfVar1;
          fVar217 = pfVar1[1];
          fVar218 = pfVar1[2];
          fVar219 = pfVar1[3];
          fVar256 = local_288 * fVar106 +
                    local_198 * fVar156 + fVar155 * fVar183 + (float)uVar295 * fVar213;
          fVar263 = fStack_284 * fVar136 +
                    fStack_194 * fVar172 + fVar67 * fVar185 + (float)uVar249 * fVar217;
          fVar264 = fStack_280 * fVar139 +
                    fStack_190 * fVar173 + fVar101 * fVar188 + (float)uVar253 * fVar218;
          fVar265 = fStack_27c * fVar154 +
                    fStack_18c * fVar174 + fVar103 * fVar212 + fVar250 * fVar219;
          fVar266 = local_178 * fVar106 +
                    local_1a8 * fVar156 + fVar211 * fVar183 + local_418 * fVar213;
          fVar276 = fStack_174 * fVar136 +
                    fStack_1a4 * fVar172 + fVar211 * fVar185 + fStack_414 * fVar217;
          fVar277 = fStack_170 * fVar139 +
                    fStack_1a0 * fVar173 + fVar211 * fVar188 + fStack_410 * fVar218;
          fVar279 = fStack_16c * fVar154 +
                    fStack_19c * fVar174 + fVar211 * fVar212 + fStack_40c * fVar219;
          auVar166._0_4_ =
               local_98 * fVar106 + local_88 * fVar156 + local_188 * fVar183 + local_58 * fVar213;
          auVar166._4_4_ =
               fStack_94 * fVar136 +
               fStack_84 * fVar172 + fStack_184 * fVar185 + fStack_54 * fVar217;
          auVar166._8_4_ =
               fStack_90 * fVar139 +
               fStack_80 * fVar173 + fStack_180 * fVar188 + fStack_50 * fVar218;
          auVar166._12_4_ =
               fStack_8c * fVar154 +
               fStack_7c * fVar174 + fStack_17c * fVar212 + fStack_4c * fVar219;
          fVar184 = fVar256 - local_1b8;
          fVar186 = fVar263 - fStack_1b4;
          fVar187 = fVar264 - fStack_1b0;
          fVar248 = fVar265 - fStack_1ac;
          fVar282 = fVar266 - local_1c8;
          fVar289 = fVar276 - fStack_1c4;
          fVar291 = fVar277 - fStack_1c0;
          fVar293 = fVar279 - fStack_1bc;
          fVar155 = local_1c8 * fVar184 - local_1b8 * fVar282;
          fVar67 = fStack_1c4 * fVar186 - fStack_1b4 * fVar289;
          fVar101 = fStack_1c0 * fVar187 - fStack_1b0 * fVar291;
          fVar103 = fStack_1bc * fVar248 - fStack_1ac * fVar293;
          auVar70 = maxps(_local_428,auVar166);
          bVar44 = fVar155 * fVar155 <=
                   auVar70._0_4_ * auVar70._0_4_ * (fVar184 * fVar184 + fVar282 * fVar282) &&
                   (int)uVar62 < local_68;
          auVar286._0_4_ = -(uint)bVar44;
          bVar45 = fVar67 * fVar67 <=
                   auVar70._4_4_ * auVar70._4_4_ * (fVar186 * fVar186 + fVar289 * fVar289) &&
                   (int)(uVar62 | 1) < iStack_64;
          auVar286._4_4_ = -(uint)bVar45;
          bVar46 = fVar101 * fVar101 <=
                   auVar70._8_4_ * auVar70._8_4_ * (fVar187 * fVar187 + fVar291 * fVar291) &&
                   (int)(uVar62 | 2) < iStack_60;
          auVar286._8_4_ = -(uint)bVar46;
          bVar47 = fVar103 * fVar103 <=
                   auVar70._12_4_ * auVar70._12_4_ * (fVar248 * fVar248 + fVar293 * fVar293) &&
                   (int)(uVar62 | 3) < iStack_5c;
          auVar286._12_4_ = -(uint)bVar47;
          uVar61 = movmskps((int)uVar54,auVar286);
          uVar54 = (ulong)uVar61;
          fVar238 = local_378;
          fVar239 = fStack_374;
          fVar281 = fStack_370;
          fVar228 = fStack_36c;
          fVar230 = local_388;
          fVar231 = fStack_384;
          fVar240 = fStack_380;
          fVar246 = fStack_37c;
          fVar155 = local_3a8;
          fVar67 = fStack_3a4;
          fVar101 = fStack_3a0;
          fVar103 = fStack_39c;
          if (uVar61 != 0) {
            local_248._4_4_ = fVar289;
            local_248._0_4_ = fVar282;
            fStack_240 = fVar291;
            fStack_23c = fVar293;
            _local_1e8 = auVar286;
            local_438 = auVar166;
            fVar294 = fVar213 * local_3f8 + fVar183 * local_3b8 + fVar156 * local_2c8 +
                      fVar106 * (float)local_3d8._0_4_;
            fVar303 = fVar217 * fStack_3f4 + fVar185 * fStack_3b4 + fVar172 * fStack_2c4 +
                      fVar136 * (float)local_3d8._4_4_;
            fVar305 = fVar218 * fStack_3f0 + fVar188 * fStack_3b0 + fVar173 * fStack_2c0 +
                      fVar139 * fStack_3d0;
            fVar68 = fVar219 * fStack_3ec + fVar212 * fStack_3ac + fVar174 * fStack_2bc +
                     fVar154 * fStack_3cc;
            local_2a8._0_4_ = auVar23._0_4_;
            local_2a8._4_4_ = auVar23._4_4_;
            fStack_2a0 = auVar23._8_4_;
            fVar108 = local_298 * local_3f8 + local_2b8 * local_3b8 + local_368 * local_2c8 +
                      (float)local_2a8._0_4_ * (float)local_3d8._0_4_;
            fVar137 = fStack_294 * fStack_3f4 + fStack_2b4 * fStack_3b4 + fStack_364 * fStack_2c4 +
                      (float)local_2a8._4_4_ * (float)local_3d8._4_4_;
            fVar138 = fStack_290 * fStack_3f0 + fStack_2b0 * fStack_3b0 + fStack_360 * fStack_2c0 +
                      fStack_2a0 * fStack_3d0;
            fVar140 = fStack_28c * fStack_3ec + fStack_2ac * fStack_3ac + fStack_35c * fStack_2bc +
                      fVar144 * fStack_3cc;
            pfVar1 = (float *)(lVar20 + 0x222cd38 + lVar59 * 4);
            fVar106 = *pfVar1;
            fVar136 = pfVar1[1];
            fVar139 = pfVar1[2];
            fVar144 = pfVar1[3];
            pfVar1 = (float *)(lVar20 + 0x222d1bc + lVar59 * 4);
            fVar154 = *pfVar1;
            fVar156 = pfVar1[1];
            fVar172 = pfVar1[2];
            fVar173 = pfVar1[3];
            pfVar1 = (float *)(lVar20 + 0x222d640 + lVar59 * 4);
            fVar174 = *pfVar1;
            fVar183 = pfVar1[1];
            fVar185 = pfVar1[2];
            fVar188 = pfVar1[3];
            pfVar1 = (float *)(lVar20 + 0x222dac4 + lVar59 * 4);
            fVar212 = *pfVar1;
            fVar213 = pfVar1[1];
            fVar217 = pfVar1[2];
            fVar218 = pfVar1[3];
            fVar141 = local_288 * fVar106 +
                      local_198 * fVar154 + local_3a8 * fVar174 + (float)uVar295 * fVar212;
            fVar142 = fStack_284 * fVar136 +
                      fStack_194 * fVar156 + fStack_3a4 * fVar183 + (float)uVar249 * fVar213;
            fVar143 = fStack_280 * fVar139 +
                      fStack_190 * fVar172 + fStack_3a0 * fVar185 + (float)uVar253 * fVar217;
            fVar241 = fStack_27c * fVar144 +
                      fStack_18c * fVar173 + fStack_39c * fVar188 + fVar250 * fVar218;
            fVar102 = local_178 * fVar106 +
                      local_1a8 * fVar154 + fVar211 * fVar174 + local_418 * fVar212;
            fVar104 = fStack_174 * fVar136 +
                      fStack_1a4 * fVar156 + fVar211 * fVar183 + fStack_414 * fVar213;
            fVar105 = fStack_170 * fVar139 +
                      fStack_1a0 * fVar172 + fVar211 * fVar185 + fStack_410 * fVar217;
            fVar107 = fStack_16c * fVar144 +
                      fStack_19c * fVar173 + fVar211 * fVar188 + fStack_40c * fVar218;
            pfVar1 = (float *)(lVar20 + 0x222f158 + lVar59 * 4);
            fVar219 = *pfVar1;
            fVar238 = pfVar1[1];
            fVar239 = pfVar1[2];
            fVar281 = pfVar1[3];
            pfVar1 = (float *)(lVar20 + 0x222fa60 + lVar59 * 4);
            fVar228 = *pfVar1;
            fVar230 = pfVar1[1];
            fVar231 = pfVar1[2];
            fVar240 = pfVar1[3];
            pfVar1 = (float *)(lVar20 + 0x222fee4 + lVar59 * 4);
            fVar246 = *pfVar1;
            fVar252 = pfVar1[1];
            fVar255 = pfVar1[2];
            fVar278 = pfVar1[3];
            pfVar1 = (float *)(lVar20 + 0x222f5dc + lVar59 * 4);
            fVar280 = *pfVar1;
            fVar283 = pfVar1[1];
            fVar290 = pfVar1[2];
            fVar292 = pfVar1[3];
            fVar247 = local_288 * fVar219 +
                      local_198 * fVar280 + local_3a8 * fVar228 + (float)uVar295 * fVar246;
            fVar251 = fStack_284 * fVar238 +
                      fStack_194 * fVar283 + fStack_3a4 * fVar230 + (float)uVar249 * fVar252;
            fVar254 = fStack_280 * fVar239 +
                      fStack_190 * fVar290 + fStack_3a0 * fVar231 + (float)uVar253 * fVar255;
            fVar296 = fStack_27c * fVar281 +
                      fStack_18c * fVar292 + fStack_39c * fVar240 + fVar250 * fVar278;
            fVar299 = local_178 * fVar219 +
                      local_1a8 * fVar280 + fVar211 * fVar228 + local_418 * fVar246;
            fVar300 = fStack_174 * fVar238 +
                      fStack_1a4 * fVar283 + fVar211 * fVar230 + fStack_414 * fVar252;
            fVar301 = fStack_170 * fVar239 +
                      fStack_1a0 * fVar290 + fVar211 * fVar231 + fStack_410 * fVar255;
            fVar302 = fStack_16c * fVar281 +
                      fStack_19c * fVar292 + fVar211 * fVar240 + fStack_40c * fVar278;
            auVar275._0_8_ = CONCAT44(fVar142,fVar141) & 0x7fffffff7fffffff;
            auVar275._8_4_ = ABS(fVar143);
            auVar275._12_4_ = ABS(fVar241);
            auVar208._0_8_ = CONCAT44(fVar104,fVar102) & 0x7fffffff7fffffff;
            auVar208._8_4_ = ABS(fVar105);
            auVar208._12_4_ = ABS(fVar107);
            auVar70 = maxps(auVar275,auVar208);
            auVar287._0_8_ =
                 CONCAT44(fVar136 * (float)local_3d8._4_4_ +
                          fVar156 * fStack_2c4 + fVar183 * fStack_3b4 + fVar213 * fStack_3f4,
                          fVar106 * (float)local_3d8._0_4_ +
                          fVar154 * local_2c8 + fVar174 * local_3b8 + fVar212 * local_3f8) &
                 0x7fffffff7fffffff;
            auVar287._8_4_ =
                 ABS(fVar139 * fStack_3d0 +
                     fVar172 * fStack_2c0 + fVar185 * fStack_3b0 + fVar217 * fStack_3f0);
            auVar287._12_4_ =
                 ABS(fVar144 * fStack_3cc +
                     fVar173 * fStack_2bc + fVar188 * fStack_3ac + fVar218 * fStack_3ec);
            auVar70 = maxps(auVar70,auVar287);
            uVar61 = -(uint)(local_3e8 <= auVar70._0_4_);
            uVar63 = -(uint)(fStack_3e4 <= auVar70._4_4_);
            uVar64 = -(uint)(fStack_3e0 <= auVar70._8_4_);
            uVar65 = -(uint)(fStack_3dc <= auVar70._12_4_);
            auVar209._0_4_ = ~uVar61 & (uint)fVar184;
            auVar209._4_4_ = ~uVar63 & (uint)fVar186;
            auVar209._8_4_ = ~uVar64 & (uint)fVar187;
            auVar209._12_4_ = ~uVar65 & (uint)fVar248;
            auVar262._0_4_ = (uint)fVar141 & uVar61;
            auVar262._4_4_ = (uint)fVar142 & uVar63;
            auVar262._8_4_ = (uint)fVar143 & uVar64;
            auVar262._12_4_ = (uint)fVar241 & uVar65;
            auVar262 = auVar262 | auVar209;
            fVar183 = (float)(~uVar61 & (uint)fVar282 | (uint)fVar102 & uVar61);
            fVar185 = (float)(~uVar63 & (uint)fVar289 | (uint)fVar104 & uVar63);
            fVar188 = (float)(~uVar64 & (uint)fVar291 | (uint)fVar105 & uVar64);
            fVar250 = (float)(~uVar65 & (uint)fVar293 | (uint)fVar107 & uVar65);
            auVar288._0_8_ = CONCAT44(fVar251,fVar247) & 0x7fffffff7fffffff;
            auVar288._8_4_ = ABS(fVar254);
            auVar288._12_4_ = ABS(fVar296);
            auVar148._0_8_ = CONCAT44(fVar300,fVar299) & 0x7fffffff7fffffff;
            auVar148._8_4_ = ABS(fVar301);
            auVar148._12_4_ = ABS(fVar302);
            auVar70 = maxps(auVar288,auVar148);
            auVar95._0_8_ =
                 CONCAT44(fVar238 * (float)local_3d8._4_4_ +
                          fVar283 * fStack_2c4 + fVar230 * fStack_3b4 + fVar252 * fStack_3f4,
                          fVar219 * (float)local_3d8._0_4_ +
                          fVar280 * local_2c8 + fVar228 * local_3b8 + fVar246 * local_3f8) &
                 0x7fffffff7fffffff;
            auVar95._8_4_ =
                 ABS(fVar239 * fStack_3d0 +
                     fVar290 * fStack_2c0 + fVar231 * fStack_3b0 + fVar255 * fStack_3f0);
            auVar95._12_4_ =
                 ABS(fVar281 * fStack_3cc +
                     fVar292 * fStack_2bc + fVar240 * fStack_3ac + fVar278 * fStack_3ec);
            auVar70 = maxps(auVar70,auVar95);
            uVar61 = -(uint)(local_3e8 <= auVar70._0_4_);
            uVar63 = -(uint)(fStack_3e4 <= auVar70._4_4_);
            uVar64 = -(uint)(fStack_3e0 <= auVar70._8_4_);
            uVar65 = -(uint)(fStack_3dc <= auVar70._12_4_);
            fVar255 = (float)((uint)fVar247 & uVar61 | ~uVar61 & (uint)fVar184);
            fVar280 = (float)((uint)fVar251 & uVar63 | ~uVar63 & (uint)fVar186);
            fVar290 = (float)((uint)fVar254 & uVar64 | ~uVar64 & (uint)fVar187);
            fVar248 = (float)((uint)fVar296 & uVar65 | ~uVar65 & (uint)fVar248);
            fVar281 = (float)(~uVar61 & (uint)fVar282 | (uint)fVar299 & uVar61);
            fVar228 = (float)(~uVar63 & (uint)fVar289 | (uint)fVar300 & uVar63);
            fVar231 = (float)(~uVar64 & (uint)fVar291 | (uint)fVar301 & uVar64);
            fVar246 = (float)(~uVar65 & (uint)fVar293 | (uint)fVar302 & uVar65);
            fVar174 = auVar262._0_4_;
            fVar106 = auVar262._4_4_;
            fVar136 = auVar262._8_4_;
            fVar139 = auVar262._12_4_;
            auVar179._0_4_ = fVar183 * fVar183 + fVar174 * fVar174;
            auVar179._4_4_ = fVar185 * fVar185 + fVar106 * fVar106;
            auVar179._8_4_ = fVar188 * fVar188 + fVar136 * fVar136;
            auVar179._12_4_ = fVar250 * fVar250 + fVar139 * fVar139;
            auVar70 = rsqrtps(auVar209,auVar179);
            fVar144 = auVar70._0_4_;
            fVar154 = auVar70._4_4_;
            fVar156 = auVar70._8_4_;
            fVar172 = auVar70._12_4_;
            auVar210._0_4_ = fVar144 * fVar144 * auVar179._0_4_ * 0.5 * fVar144;
            auVar210._4_4_ = fVar154 * fVar154 * auVar179._4_4_ * 0.5 * fVar154;
            auVar210._8_4_ = fVar156 * fVar156 * auVar179._8_4_ * 0.5 * fVar156;
            auVar210._12_4_ = fVar172 * fVar172 * auVar179._12_4_ * 0.5 * fVar172;
            fVar173 = fVar144 * 1.5 - auVar210._0_4_;
            fVar213 = fVar154 * 1.5 - auVar210._4_4_;
            fVar218 = fVar156 * 1.5 - auVar210._8_4_;
            fVar238 = fVar172 * 1.5 - auVar210._12_4_;
            auVar180._0_4_ = fVar281 * fVar281 + fVar255 * fVar255;
            auVar180._4_4_ = fVar228 * fVar228 + fVar280 * fVar280;
            auVar180._8_4_ = fVar231 * fVar231 + fVar290 * fVar290;
            auVar180._12_4_ = fVar246 * fVar246 + fVar248 * fVar248;
            auVar70 = rsqrtps(auVar210,auVar180);
            fVar144 = auVar70._0_4_;
            fVar154 = auVar70._4_4_;
            fVar156 = auVar70._8_4_;
            fVar172 = auVar70._12_4_;
            fVar212 = fVar144 * 1.5 - fVar144 * fVar144 * auVar180._0_4_ * 0.5 * fVar144;
            fVar217 = fVar154 * 1.5 - fVar154 * fVar154 * auVar180._4_4_ * 0.5 * fVar154;
            fVar219 = fVar156 * 1.5 - fVar156 * fVar156 * auVar180._8_4_ * 0.5 * fVar156;
            fVar239 = fVar172 * 1.5 - fVar172 * fVar172 * auVar180._12_4_ * 0.5 * fVar172;
            fVar187 = fVar183 * fVar173 * (float)local_428._0_4_;
            fVar252 = fVar185 * fVar213 * (float)local_428._4_4_;
            fVar278 = fVar188 * fVar218 * (float)uStack_420;
            fVar283 = fVar250 * fVar238 * register0x0000124c;
            fVar174 = -fVar174 * fVar173 * (float)local_428._0_4_;
            fVar183 = -fVar106 * fVar213 * (float)local_428._4_4_;
            fVar185 = -fVar136 * fVar218 * (float)uStack_420;
            fVar188 = -fVar139 * fVar238 * register0x0000124c;
            fVar230 = fVar173 * 0.0 * (float)local_428._0_4_;
            fVar240 = fVar213 * 0.0 * (float)local_428._4_4_;
            fVar250 = fVar218 * 0.0 * (float)uStack_420;
            fVar289 = fVar238 * 0.0 * register0x0000124c;
            local_298 = fVar108 + fVar230;
            fStack_294 = fVar137 + fVar240;
            fStack_290 = fVar138 + fVar250;
            fStack_28c = fVar140 + fVar289;
            fVar292 = fVar281 * fVar212 * auVar166._0_4_;
            fVar102 = fVar228 * fVar217 * auVar166._4_4_;
            fVar104 = fVar231 * fVar219 * auVar166._8_4_;
            fVar105 = fVar246 * fVar239 * auVar166._12_4_;
            fVar291 = fVar256 + fVar292;
            fVar293 = fVar263 + fVar102;
            fVar184 = fVar264 + fVar104;
            fVar186 = fVar265 + fVar105;
            fVar106 = -fVar255 * fVar212 * auVar166._0_4_;
            fVar136 = -fVar280 * fVar217 * auVar166._4_4_;
            fVar139 = -fVar290 * fVar219 * auVar166._8_4_;
            fVar144 = -fVar248 * fVar239 * auVar166._12_4_;
            fVar154 = fVar266 + fVar106;
            fVar156 = fVar276 + fVar136;
            fVar172 = fVar277 + fVar139;
            fVar173 = fVar279 + fVar144;
            fVar213 = fVar212 * 0.0 * auVar166._0_4_;
            fVar218 = fVar217 * 0.0 * auVar166._4_4_;
            fVar238 = fVar219 * 0.0 * auVar166._8_4_;
            fVar281 = fVar239 * 0.0 * auVar166._12_4_;
            fVar212 = local_1b8 - fVar187;
            fVar217 = fStack_1b4 - fVar252;
            fVar219 = fStack_1b0 - fVar278;
            fVar239 = fStack_1ac - fVar283;
            fVar248 = fVar294 + fVar213;
            fVar255 = fVar303 + fVar218;
            fVar280 = fVar305 + fVar238;
            fVar290 = fVar68 + fVar281;
            fVar228 = local_1c8 - fVar174;
            fVar231 = fStack_1c4 - fVar183;
            fVar246 = fStack_1c0 - fVar185;
            fVar282 = fStack_1bc - fVar188;
            fVar108 = fVar108 - fVar230;
            fVar137 = fVar137 - fVar240;
            fVar138 = fVar138 - fVar250;
            fVar140 = fVar140 - fVar289;
            uVar61 = -(uint)(0.0 < (fVar228 * (fVar248 - fVar108) - fVar108 * (fVar154 - fVar228)) *
                                   0.0 + (fVar108 * (fVar291 - fVar212) -
                                         (fVar248 - fVar108) * fVar212) * 0.0 +
                                         ((fVar154 - fVar228) * fVar212 -
                                         (fVar291 - fVar212) * fVar228));
            uVar63 = -(uint)(0.0 < (fVar231 * (fVar255 - fVar137) - fVar137 * (fVar156 - fVar231)) *
                                   0.0 + (fVar137 * (fVar293 - fVar217) -
                                         (fVar255 - fVar137) * fVar217) * 0.0 +
                                         ((fVar156 - fVar231) * fVar217 -
                                         (fVar293 - fVar217) * fVar231));
            uVar64 = -(uint)(0.0 < (fVar246 * (fVar280 - fVar138) - fVar138 * (fVar172 - fVar246)) *
                                   0.0 + (fVar138 * (fVar184 - fVar219) -
                                         (fVar280 - fVar138) * fVar219) * 0.0 +
                                         ((fVar172 - fVar246) * fVar219 -
                                         (fVar184 - fVar219) * fVar246));
            uVar65 = -(uint)(0.0 < (fVar282 * (fVar290 - fVar140) - fVar140 * (fVar173 - fVar282)) *
                                   0.0 + (fVar140 * (fVar186 - fVar239) -
                                         (fVar290 - fVar140) * fVar239) * 0.0 +
                                         ((fVar173 - fVar282) * fVar239 -
                                         (fVar186 - fVar239) * fVar282));
            fVar292 = (float)((uint)(fVar256 - fVar292) & uVar61 |
                             ~uVar61 & (uint)(local_1b8 + fVar187));
            fVar102 = (float)((uint)(fVar263 - fVar102) & uVar63 |
                             ~uVar63 & (uint)(fStack_1b4 + fVar252));
            fVar278 = (float)((uint)(fVar264 - fVar104) & uVar64 |
                             ~uVar64 & (uint)(fStack_1b0 + fVar278));
            fVar283 = (float)((uint)(fVar265 - fVar105) & uVar65 |
                             ~uVar65 & (uint)(fStack_1ac + fVar283));
            fVar263 = (float)((uint)(fVar266 - fVar106) & uVar61 |
                             ~uVar61 & (uint)(local_1c8 + fVar174));
            fVar264 = (float)((uint)(fVar276 - fVar136) & uVar63 |
                             ~uVar63 & (uint)(fStack_1c4 + fVar183));
            fVar265 = (float)((uint)(fVar277 - fVar139) & uVar64 |
                             ~uVar64 & (uint)(fStack_1c0 + fVar185));
            fVar266 = (float)((uint)(fVar279 - fVar144) & uVar65 |
                             ~uVar65 & (uint)(fStack_1bc + fVar188));
            fVar276 = (float)((uint)(fVar294 - fVar213) & uVar61 | ~uVar61 & (uint)local_298);
            fVar277 = (float)((uint)(fVar303 - fVar218) & uVar63 | ~uVar63 & (uint)fStack_294);
            fVar279 = (float)((uint)(fVar305 - fVar238) & uVar64 | ~uVar64 & (uint)fStack_290);
            fVar289 = (float)((uint)(fVar68 - fVar281) & uVar65 | ~uVar65 & (uint)fStack_28c);
            fVar213 = (float)((uint)fVar212 & uVar61 | ~uVar61 & (uint)fVar291);
            fVar218 = (float)((uint)fVar217 & uVar63 | ~uVar63 & (uint)fVar293);
            fVar238 = (float)((uint)fVar219 & uVar64 | ~uVar64 & (uint)fVar184);
            fVar281 = (float)((uint)fVar239 & uVar65 | ~uVar65 & (uint)fVar186);
            fVar230 = (float)((uint)fVar228 & uVar61 | ~uVar61 & (uint)fVar154);
            fVar240 = (float)((uint)fVar231 & uVar63 | ~uVar63 & (uint)fVar156);
            fVar250 = (float)((uint)fVar246 & uVar64 | ~uVar64 & (uint)fVar172);
            fVar256 = (float)((uint)fVar282 & uVar65 | ~uVar65 & (uint)fVar173);
            fVar174 = (float)((uint)fVar108 & uVar61 | ~uVar61 & (uint)fVar248);
            fVar183 = (float)((uint)fVar137 & uVar63 | ~uVar63 & (uint)fVar255);
            fVar185 = (float)((uint)fVar138 & uVar64 | ~uVar64 & (uint)fVar280);
            fVar188 = (float)((uint)fVar140 & uVar65 | ~uVar65 & (uint)fVar290);
            fVar291 = (float)((uint)fVar291 & uVar61 | ~uVar61 & (uint)fVar212) - fVar292;
            fVar293 = (float)((uint)fVar293 & uVar63 | ~uVar63 & (uint)fVar217) - fVar102;
            fVar184 = (float)((uint)fVar184 & uVar64 | ~uVar64 & (uint)fVar219) - fVar278;
            fVar186 = (float)((uint)fVar186 & uVar65 | ~uVar65 & (uint)fVar239) - fVar283;
            fVar154 = (float)((uint)fVar154 & uVar61 | ~uVar61 & (uint)fVar228) - fVar263;
            fVar156 = (float)((uint)fVar156 & uVar63 | ~uVar63 & (uint)fVar231) - fVar264;
            fVar172 = (float)((uint)fVar172 & uVar64 | ~uVar64 & (uint)fVar246) - fVar265;
            fVar173 = (float)((uint)fVar173 & uVar65 | ~uVar65 & (uint)fVar282) - fVar266;
            fVar228 = (float)((uint)fVar248 & uVar61 | ~uVar61 & (uint)fVar108) - fVar276;
            fVar231 = (float)((uint)fVar255 & uVar63 | ~uVar63 & (uint)fVar137) - fVar277;
            fVar246 = (float)((uint)fVar280 & uVar64 | ~uVar64 & (uint)fVar138) - fVar279;
            fVar282 = (float)((uint)fVar290 & uVar65 | ~uVar65 & (uint)fVar140) - fVar289;
            fVar280 = fVar292 - fVar213;
            fVar290 = fVar102 - fVar218;
            fVar294 = fVar278 - fVar238;
            fVar303 = fVar283 - fVar281;
            fVar106 = fVar263 - fVar230;
            fVar136 = fVar264 - fVar240;
            fVar139 = fVar265 - fVar250;
            fVar144 = fVar266 - fVar256;
            auVar149._0_4_ = fVar263 * fVar291;
            auVar149._4_4_ = fVar264 * fVar293;
            auVar149._8_4_ = fVar265 * fVar184;
            auVar149._12_4_ = fVar266 * fVar186;
            local_408 = CONCAT44(fVar102,fVar292);
            uStack_400 = CONCAT44(fVar283,fVar278);
            fVar212 = fVar276 - fVar174;
            fVar217 = fVar277 - fVar183;
            fVar219 = fVar279 - fVar185;
            fVar239 = fVar289 - fVar188;
            fVar187 = (fVar263 * fVar228 - fVar276 * fVar154) * 0.0 +
                      (fVar276 * fVar291 - fVar292 * fVar228) * 0.0 +
                      (fVar292 * fVar154 - auVar149._0_4_);
            fVar248 = (fVar264 * fVar231 - fVar277 * fVar156) * 0.0 +
                      (fVar277 * fVar293 - fVar102 * fVar231) * 0.0 +
                      (fVar102 * fVar156 - auVar149._4_4_);
            auVar167._4_4_ = fVar248;
            auVar167._0_4_ = fVar187;
            fVar252 = (fVar265 * fVar246 - fVar279 * fVar172) * 0.0 +
                      (fVar279 * fVar184 - fVar278 * fVar246) * 0.0 +
                      (fVar278 * fVar172 - auVar149._8_4_);
            fVar255 = (fVar266 * fVar282 - fVar289 * fVar173) * 0.0 +
                      (fVar289 * fVar186 - fVar283 * fVar282) * 0.0 +
                      (fVar283 * fVar173 - auVar149._12_4_);
            auVar298._0_4_ =
                 (fVar230 * fVar212 - fVar174 * fVar106) * 0.0 +
                 (fVar174 * fVar280 - fVar213 * fVar212) * 0.0 +
                 (fVar213 * fVar106 - fVar230 * fVar280);
            auVar298._4_4_ =
                 (fVar240 * fVar217 - fVar183 * fVar136) * 0.0 +
                 (fVar183 * fVar290 - fVar218 * fVar217) * 0.0 +
                 (fVar218 * fVar136 - fVar240 * fVar290);
            auVar298._8_4_ =
                 (fVar250 * fVar219 - fVar185 * fVar139) * 0.0 +
                 (fVar185 * fVar294 - fVar238 * fVar219) * 0.0 +
                 (fVar238 * fVar139 - fVar250 * fVar294);
            auVar298._12_4_ =
                 (fVar256 * fVar239 - fVar188 * fVar144) * 0.0 +
                 (fVar188 * fVar303 - fVar281 * fVar239) * 0.0 +
                 (fVar281 * fVar144 - fVar256 * fVar303);
            auVar167._8_4_ = fVar252;
            auVar167._12_4_ = fVar255;
            auVar70 = maxps(auVar167,auVar298);
            bVar44 = auVar70._0_4_ <= 0.0 && bVar44;
            auVar168._0_4_ = -(uint)bVar44;
            bVar45 = auVar70._4_4_ <= 0.0 && bVar45;
            auVar168._4_4_ = -(uint)bVar45;
            bVar46 = auVar70._8_4_ <= 0.0 && bVar46;
            auVar168._8_4_ = -(uint)bVar46;
            bVar47 = auVar70._12_4_ <= 0.0 && bVar47;
            auVar168._12_4_ = -(uint)bVar47;
            iVar48 = movmskps((int)(bspline_basis1 + lVar20),auVar168);
            if (iVar48 == 0) {
LAB_00be6927:
              auVar150._8_8_ = uStack_2e0;
              auVar150._0_8_ = local_2e8;
            }
            else {
              fVar174 = (ray->super_RayK<1>).tfar;
              fVar183 = fVar106 * fVar228 - fVar212 * fVar154;
              fVar185 = fVar136 * fVar231 - fVar217 * fVar156;
              fVar188 = fVar139 * fVar246 - fVar219 * fVar172;
              fVar213 = fVar144 * fVar282 - fVar239 * fVar173;
              fVar212 = fVar212 * fVar291 - fVar228 * fVar280;
              fVar217 = fVar217 * fVar293 - fVar231 * fVar290;
              fVar218 = fVar219 * fVar184 - fVar246 * fVar294;
              fVar219 = fVar239 * fVar186 - fVar282 * fVar303;
              fVar154 = fVar280 * fVar154 - fVar106 * fVar291;
              fVar156 = fVar290 * fVar156 - fVar136 * fVar293;
              fVar172 = fVar294 * fVar172 - fVar139 * fVar184;
              fVar173 = fVar303 * fVar173 - fVar144 * fVar186;
              auVar216._0_4_ = fVar183 * 0.0 + fVar212 * 0.0 + fVar154;
              auVar216._4_4_ = fVar185 * 0.0 + fVar217 * 0.0 + fVar156;
              auVar216._8_4_ = fVar188 * 0.0 + fVar218 * 0.0 + fVar172;
              auVar216._12_4_ = fVar213 * 0.0 + fVar219 * 0.0 + fVar173;
              auVar70 = rcpps(auVar149,auVar216);
              fVar106 = auVar70._0_4_;
              fVar136 = auVar70._4_4_;
              fVar139 = auVar70._8_4_;
              fVar144 = auVar70._12_4_;
              fVar106 = (1.0 - auVar216._0_4_ * fVar106) * fVar106 + fVar106;
              fVar136 = (1.0 - auVar216._4_4_ * fVar136) * fVar136 + fVar136;
              fVar139 = (1.0 - auVar216._8_4_ * fVar139) * fVar139 + fVar139;
              fVar144 = (1.0 - auVar216._12_4_ * fVar144) * fVar144 + fVar144;
              fVar154 = (fVar276 * fVar154 + fVar263 * fVar212 + fVar292 * fVar183) * fVar106;
              fVar156 = (fVar277 * fVar156 + fVar264 * fVar217 + fVar102 * fVar185) * fVar136;
              fVar172 = (fVar279 * fVar172 + fVar265 * fVar218 + fVar278 * fVar188) * fVar139;
              fVar173 = (fVar289 * fVar173 + fVar266 * fVar219 + fVar283 * fVar213) * fVar144;
              bVar44 = ((float)local_208._0_4_ <= fVar154 && fVar154 <= fVar174) && bVar44;
              auVar181._0_4_ = -(uint)bVar44;
              bVar45 = ((float)local_208._4_4_ <= fVar156 && fVar156 <= fVar174) && bVar45;
              auVar181._4_4_ = -(uint)bVar45;
              bVar46 = (fStack_200 <= fVar172 && fVar172 <= fVar174) && bVar46;
              auVar181._8_4_ = -(uint)bVar46;
              bVar47 = (fStack_1fc <= fVar173 && fVar173 <= fVar174) && bVar47;
              auVar181._12_4_ = -(uint)bVar47;
              iVar48 = movmskps(iVar48,auVar181);
              if (iVar48 == 0) goto LAB_00be6927;
              auVar182._0_8_ =
                   CONCAT44(-(uint)(auVar216._4_4_ != 0.0 && bVar45),
                            -(uint)(auVar216._0_4_ != 0.0 && bVar44));
              auVar182._8_4_ = -(uint)(auVar216._8_4_ != 0.0 && bVar46);
              auVar182._12_4_ = -(uint)(auVar216._12_4_ != 0.0 && bVar47);
              iVar48 = movmskps(iVar48,auVar182);
              auVar150._8_8_ = uStack_2e0;
              auVar150._0_8_ = local_2e8;
              if (iVar48 != 0) {
                fVar187 = fVar187 * fVar106;
                fVar248 = fVar248 * fVar136;
                fVar252 = fVar252 * fVar139;
                fVar255 = fVar255 * fVar144;
                local_378 = (float)((uint)(1.0 - fVar187) & uVar61 | ~uVar61 & (uint)fVar187);
                fStack_374 = (float)((uint)(1.0 - fVar248) & uVar63 | ~uVar63 & (uint)fVar248);
                fStack_370 = (float)((uint)(1.0 - fVar252) & uVar64 | ~uVar64 & (uint)fVar252);
                fStack_36c = (float)((uint)(1.0 - fVar255) & uVar65 | ~uVar65 & (uint)fVar255);
                local_1f8 = (float)(~uVar61 & (uint)(auVar298._0_4_ * fVar106) |
                                   (uint)(1.0 - auVar298._0_4_ * fVar106) & uVar61);
                fStack_1f4 = (float)(~uVar63 & (uint)(auVar298._4_4_ * fVar136) |
                                    (uint)(1.0 - auVar298._4_4_ * fVar136) & uVar63);
                fStack_1f0 = (float)(~uVar64 & (uint)(auVar298._8_4_ * fVar139) |
                                    (uint)(1.0 - auVar298._8_4_ * fVar139) & uVar64);
                fStack_1ec = (float)(~uVar65 & (uint)(auVar298._12_4_ * fVar144) |
                                    (uint)(1.0 - auVar298._12_4_ * fVar144) & uVar65);
                auVar150._8_4_ = auVar182._8_4_;
                auVar150._0_8_ = auVar182._0_8_;
                auVar150._12_4_ = auVar182._12_4_;
                local_388 = fVar154;
                fStack_384 = fVar156;
                fStack_380 = fVar172;
                fStack_37c = fVar173;
              }
            }
            iVar48 = movmskps(iVar48,auVar150);
            fVar238 = local_378;
            fVar239 = fStack_374;
            fVar281 = fStack_370;
            fVar228 = fStack_36c;
            fVar230 = local_388;
            fVar231 = fStack_384;
            fVar240 = fStack_380;
            fVar246 = fStack_37c;
            uVar295 = local_44c.m128[1];
            uVar249 = local_44c.m128[2];
            uVar253 = local_44c.m128[3];
            fVar250 = fStack_43c;
            if (iVar48 != 0) {
              fVar136 = (auVar166._0_4_ - (float)local_428._0_4_) * local_378 +
                        (float)local_428._0_4_;
              fVar139 = (auVar166._4_4_ - (float)local_428._4_4_) * fStack_374 +
                        (float)local_428._4_4_;
              fVar144 = (auVar166._8_4_ - (float)uStack_420) * fStack_370 + (float)uStack_420;
              fVar154 = (auVar166._12_4_ - register0x0000124c) * fStack_36c + register0x0000124c;
              fVar106 = local_320->depth_scale;
              auVar96._0_4_ = -(uint)(fVar106 * (fVar136 + fVar136) < local_388) & auVar150._0_4_;
              auVar96._4_4_ = -(uint)(fVar106 * (fVar139 + fVar139) < fStack_384) & auVar150._4_4_;
              auVar96._8_4_ = -(uint)(fVar106 * (fVar144 + fVar144) < fStack_380) & auVar150._8_4_;
              auVar96._12_4_ = -(uint)(fVar106 * (fVar154 + fVar154) < fStack_37c) & auVar150._12_4_
              ;
              iVar48 = movmskps((int)local_320,auVar96);
              if (iVar48 != 0) {
                local_1f8 = local_1f8 + local_1f8 + -1.0;
                fStack_1f4 = fStack_1f4 + fStack_1f4 + -1.0;
                fStack_1f0 = fStack_1f0 + fStack_1f0 + -1.0;
                fStack_1ec = fStack_1ec + fStack_1ec + -1.0;
                local_158 = local_378;
                fStack_154 = fStack_374;
                fStack_150 = fStack_370;
                fStack_14c = fStack_36c;
                local_148 = local_1f8;
                fStack_144 = fStack_1f4;
                fStack_140 = fStack_1f0;
                fStack_13c = fStack_1ec;
                local_138 = local_388;
                fStack_134 = fStack_384;
                fStack_130 = fStack_380;
                fStack_12c = fStack_37c;
                local_128 = uVar62;
                local_124 = iVar18;
                local_118 = CONCAT44(fStack_2d4,local_2d8);
                uStack_110 = CONCAT44(fStack_2cc,fStack_2d0);
                local_108 = CONCAT44(fStack_224,local_228);
                uStack_100 = CONCAT44(fStack_21c,fStack_220);
                local_f8 = CONCAT44(fStack_234,local_238);
                uStack_f0 = CONCAT44(fStack_22c,fStack_230);
                local_e8 = CONCAT44(fStack_214,local_218);
                uStack_e0 = CONCAT44(fStack_20c,fStack_210);
                local_d8 = auVar96;
                pGVar56 = (context->scene->geometries).items[(long)local_3c0].ptr;
                uVar61 = (ray->super_RayK<1>).mask;
                pRVar53 = local_3c0;
                if ((pGVar56->mask & uVar61) != 0) {
                  local_338 = auVar96;
                  fVar106 = (float)(int)uVar62;
                  local_c8[0] = (fVar106 + local_378 + 0.0) * local_78;
                  local_c8[1] = (fVar106 + fStack_374 + 1.0) * fStack_74;
                  local_c8[2] = (fVar106 + fStack_370 + 2.0) * fStack_70;
                  local_c8[3] = (fVar106 + fStack_36c + 3.0) * fStack_6c;
                  local_b8 = CONCAT44(fStack_1f4,local_1f8);
                  uStack_b0 = CONCAT44(fStack_1ec,fStack_1f0);
                  local_a8[0] = local_388;
                  local_a8[1] = fStack_384;
                  local_a8[2] = fStack_380;
                  local_a8[3] = fStack_37c;
                  auVar127._0_4_ = auVar96._0_4_ & (uint)local_388;
                  auVar127._4_4_ = auVar96._4_4_ & (uint)fStack_384;
                  auVar127._8_4_ = auVar96._8_4_ & (uint)fStack_380;
                  auVar127._12_4_ = auVar96._12_4_ & (uint)fStack_37c;
                  auVar151._0_8_ = CONCAT44(~auVar96._4_4_,~auVar96._0_4_) & 0x7f8000007f800000;
                  auVar151._8_4_ = ~auVar96._8_4_ & 0x7f800000;
                  auVar151._12_4_ = ~auVar96._12_4_ & 0x7f800000;
                  auVar151 = auVar151 | auVar127;
                  auVar169._4_4_ = auVar151._0_4_;
                  auVar169._0_4_ = auVar151._4_4_;
                  auVar169._8_4_ = auVar151._12_4_;
                  auVar169._12_4_ = auVar151._8_4_;
                  auVar70 = minps(auVar169,auVar151);
                  auVar128._0_8_ = auVar70._8_8_;
                  auVar128._8_4_ = auVar70._0_4_;
                  auVar128._12_4_ = auVar70._4_4_;
                  auVar70 = minps(auVar128,auVar70);
                  auVar129._0_8_ =
                       CONCAT44(-(uint)(auVar70._4_4_ == auVar151._4_4_) & auVar96._4_4_,
                                -(uint)(auVar70._0_4_ == auVar151._0_4_) & auVar96._0_4_);
                  auVar129._8_4_ = -(uint)(auVar70._8_4_ == auVar151._8_4_) & auVar96._8_4_;
                  auVar129._12_4_ = -(uint)(auVar70._12_4_ == auVar151._12_4_) & auVar96._12_4_;
                  iVar48 = movmskps(uVar61,auVar129);
                  if (iVar48 != 0) {
                    auVar96._8_4_ = auVar129._8_4_;
                    auVar96._0_8_ = auVar129._0_8_;
                    auVar96._12_4_ = auVar129._12_4_;
                  }
                  uVar61 = movmskps(iVar48,auVar96);
                  lVar58 = 0;
                  if (uVar61 != 0) {
                    for (; (uVar61 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar56->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar106 = local_c8[lVar58];
                    fVar136 = *(float *)((long)&local_b8 + lVar58 * 4);
                    fVar154 = 1.0 - fVar106;
                    fVar156 = fVar106 * fVar154 * 4.0;
                    fVar139 = -fVar154 * fVar154 * 0.5;
                    fVar144 = (-fVar106 * fVar106 - fVar156) * 0.5;
                    fVar154 = (fVar154 * fVar154 + fVar156) * 0.5;
                    fVar156 = fVar106 * fVar106 * 0.5;
                    (ray->super_RayK<1>).tfar = local_a8[lVar58];
                    *(ulong *)&(ray->Ng).field_0 =
                         CONCAT44(fVar139 * fStack_2d4 +
                                  fVar144 * fStack_224 + fVar154 * fStack_234 + fVar156 * fStack_214
                                  ,fVar139 * local_2d8 +
                                   fVar144 * local_228 + fVar154 * local_238 + fVar156 * local_218);
                    (ray->Ng).field_0.field_0.z =
                         fVar139 * fStack_2d0 +
                         fVar144 * fStack_220 + fVar154 * fStack_230 + fVar156 * fStack_210;
                    ray->u = fVar106;
                    ray->v = fVar136;
                    ray->primID = (uint)local_390;
                    ray->geomID = (uint)local_3c0;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    pRVar53 = (RTCIntersectArguments *)context;
                  }
                  else {
                    local_408 = CONCAT44(fStack_234,local_238);
                    uStack_400 = CONCAT44(fStack_22c,fStack_230);
                    uStack_420 = CONCAT44(fStack_20c,fStack_210);
                    local_428 = (undefined1  [8])CONCAT44(fStack_214,local_218);
                    local_438._8_8_ = auVar166._8_8_;
                    local_438._0_8_ = pGVar56;
                    do {
                      local_26c = local_c8[lVar58];
                      local_268 = *(undefined4 *)((long)&local_b8 + lVar58 * 4);
                      fVar106 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = local_a8[lVar58];
                      local_318.context = context->user;
                      fVar144 = 1.0 - local_26c;
                      fVar154 = local_26c * fVar144 * 4.0;
                      fVar136 = -fVar144 * fVar144 * 0.5;
                      fVar139 = (-local_26c * local_26c - fVar154) * 0.5;
                      fVar144 = (fVar144 * fVar144 + fVar154) * 0.5;
                      fVar154 = local_26c * local_26c * 0.5;
                      local_278 = CONCAT44(fVar136 * fStack_2d4 +
                                           fVar139 * fVar227 +
                                           fVar144 * local_408._4_4_ +
                                           fVar154 * (float)local_428._4_4_,
                                           fVar136 * local_2d8 +
                                           fVar139 * fVar226 +
                                           fVar144 * (float)local_408 +
                                           fVar154 * (float)local_428._0_4_);
                      local_270 = fVar136 * fStack_2d0 +
                                  fVar139 * fVar232 +
                                  fVar144 * (float)uStack_400 + fVar154 * (float)uStack_420;
                      local_264 = (int)local_390;
                      local_260 = (int)local_3c0;
                      local_25c = (local_318.context)->instID[0];
                      local_258 = (local_318.context)->instPrimID[0];
                      local_44c.m128[0] = -NAN;
                      local_318.valid = (int *)&local_44c;
                      pRVar53 = (RTCIntersectArguments *)pGVar56->userPtr;
                      local_318.geometryUserPtr = pRVar53;
                      local_318.ray = (RTCRayN *)ray;
                      local_318.hit = (RTCHitN *)&local_278;
                      local_318.N = 1;
                      if (pGVar56->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00be6b6b:
                        pRVar53 = context->args;
                        if ((RTCIntersectArguments *)pRVar53->filter != (RTCIntersectArguments *)0x0
                           ) {
                          if ((((ulong)*(Scene **)&pRVar53->flags & 2) != 0) ||
                             (((pGVar56->field_8).field_0x2 & 0x40) != 0)) {
                            (*(code *)pRVar53->filter)(&local_318);
                            uVar54 = extraout_RDX_00;
                            pGVar56 = (Geometry *)local_438._0_8_;
                            fVar238 = local_378;
                            fVar239 = fStack_374;
                            fVar281 = fStack_370;
                            fVar228 = fStack_36c;
                            fVar230 = local_388;
                            fVar231 = fStack_384;
                            fVar240 = fStack_380;
                            fVar246 = fStack_37c;
                            fVar155 = local_3a8;
                            fVar67 = fStack_3a4;
                            fVar101 = fStack_3a0;
                            fVar103 = fStack_39c;
                            uVar295 = local_44c.m128[1];
                            uVar249 = local_44c.m128[2];
                            uVar253 = local_44c.m128[3];
                            fVar250 = fStack_43c;
                          }
                          if (*(float *)local_318.valid == 0.0) goto LAB_00be6c34;
                        }
                        *(float *)((long)local_318.ray + 0x30) = *(float *)local_318.hit;
                        *(float *)((long)local_318.ray + 0x34) = *(float *)(local_318.hit + 4);
                        *(float *)((long)local_318.ray + 0x38) = *(float *)(local_318.hit + 8);
                        *(float *)((long)local_318.ray + 0x3c) = *(float *)(local_318.hit + 0xc);
                        *(float *)((long)local_318.ray + 0x40) = *(float *)(local_318.hit + 0x10);
                        *(float *)((long)local_318.ray + 0x44) = *(float *)(local_318.hit + 0x14);
                        *(float *)((long)local_318.ray + 0x48) = *(float *)(local_318.hit + 0x18);
                        uVar54 = (ulong)(uint)*(float *)(local_318.hit + 0x1c);
                        *(float *)((long)local_318.ray + 0x4c) = *(float *)(local_318.hit + 0x1c);
                        pRVar53 = (RTCIntersectArguments *)
                                  (ulong)(uint)*(float *)(local_318.hit + 0x20);
                        *(float *)((long)local_318.ray + 0x50) = *(float *)(local_318.hit + 0x20);
                        paVar50 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_318.ray;
                      }
                      else {
                        (*pGVar56->intersectionFilterN)(&local_318);
                        uVar54 = extraout_RDX;
                        pGVar56 = (Geometry *)local_438._0_8_;
                        fVar238 = local_378;
                        fVar239 = fStack_374;
                        fVar281 = fStack_370;
                        fVar228 = fStack_36c;
                        fVar230 = local_388;
                        fVar231 = fStack_384;
                        fVar240 = fStack_380;
                        fVar246 = fStack_37c;
                        fVar155 = local_3a8;
                        fVar67 = fStack_3a4;
                        fVar101 = fStack_3a0;
                        fVar103 = fStack_39c;
                        uVar295 = local_44c.m128[1];
                        uVar249 = local_44c.m128[2];
                        uVar253 = local_44c.m128[3];
                        fVar250 = fStack_43c;
                        if (*(float *)local_318.valid != 0.0) goto LAB_00be6b6b;
LAB_00be6c34:
                        (ray->super_RayK<1>).tfar = fVar106;
                        paVar50 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_318.valid;
                      }
                      *(undefined4 *)(local_338 + lVar58 * 4) = 0;
                      fVar106 = (ray->super_RayK<1>).tfar;
                      auVar97._0_4_ = -(uint)(fVar230 <= fVar106) & local_338._0_4_;
                      auVar97._4_4_ = -(uint)(fVar231 <= fVar106) & local_338._4_4_;
                      auVar97._8_4_ = -(uint)(fVar240 <= fVar106) & local_338._8_4_;
                      auVar97._12_4_ = -(uint)(fVar246 <= fVar106) & local_338._12_4_;
                      local_338 = auVar97;
                      iVar48 = movmskps((int)paVar50,auVar97);
                      if (iVar48 != 0) {
                        auVar130._0_4_ = auVar97._0_4_ & (uint)fVar230;
                        auVar130._4_4_ = auVar97._4_4_ & (uint)fVar231;
                        auVar130._8_4_ = auVar97._8_4_ & (uint)fVar240;
                        auVar130._12_4_ = auVar97._12_4_ & (uint)fVar246;
                        auVar152._0_8_ =
                             CONCAT44(~auVar97._4_4_,~auVar97._0_4_) & 0x7f8000007f800000;
                        auVar152._8_4_ = ~auVar97._8_4_ & 0x7f800000;
                        auVar152._12_4_ = ~auVar97._12_4_ & 0x7f800000;
                        auVar152 = auVar152 | auVar130;
                        auVar170._4_4_ = auVar152._0_4_;
                        auVar170._0_4_ = auVar152._4_4_;
                        auVar170._8_4_ = auVar152._12_4_;
                        auVar170._12_4_ = auVar152._8_4_;
                        auVar70 = minps(auVar170,auVar152);
                        auVar131._0_8_ = auVar70._8_8_;
                        auVar131._8_4_ = auVar70._0_4_;
                        auVar131._12_4_ = auVar70._4_4_;
                        auVar70 = minps(auVar131,auVar70);
                        auVar132._0_8_ =
                             CONCAT44(-(uint)(auVar70._4_4_ == auVar152._4_4_) & auVar97._4_4_,
                                      -(uint)(auVar70._0_4_ == auVar152._0_4_) & auVar97._0_4_);
                        auVar132._8_4_ = -(uint)(auVar70._8_4_ == auVar152._8_4_) & auVar97._8_4_;
                        auVar132._12_4_ =
                             -(uint)(auVar70._12_4_ == auVar152._12_4_) & auVar97._12_4_;
                        iVar51 = movmskps((int)pRVar53,auVar132);
                        if (iVar51 != 0) {
                          auVar97._8_4_ = auVar132._8_4_;
                          auVar97._0_8_ = auVar132._0_8_;
                          auVar97._12_4_ = auVar132._12_4_;
                        }
                        uVar52 = movmskps(iVar51,auVar97);
                        pRVar53 = (RTCIntersectArguments *)
                                  CONCAT44((int)((ulong)pRVar53 >> 0x20),uVar52);
                        lVar58 = 0;
                        if (pRVar53 != (RTCIntersectArguments *)0x0) {
                          for (; ((ulong)pRVar53 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                          }
                        }
                      }
                    } while ((char)iVar48 != '\0');
                  }
                }
              }
            }
          }
          uVar52 = SUB84(pRVar53,0);
          local_388 = fVar230;
          fStack_384 = fVar231;
          fStack_380 = fVar240;
          fStack_37c = fVar246;
          local_378 = fVar238;
          fStack_374 = fVar239;
          fStack_370 = fVar281;
          fStack_36c = fVar228;
          lVar59 = lVar59 + 4;
        } while ((int)lVar59 < iVar18);
      }
      fVar155 = (ray->super_RayK<1>).tfar;
      auVar126._4_4_ = -(uint)(fStack_44 <= fVar155);
      auVar126._0_4_ = -(uint)(local_48 <= fVar155);
      auVar126._8_4_ = -(uint)(fStack_40 <= fVar155);
      auVar126._12_4_ = -(uint)(fStack_3c <= fVar155);
      uVar61 = movmskps(uVar52,auVar126);
      uVar60 = uVar60 & uVar60 + 0xf & uVar61;
    } while (uVar60 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }